

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86::forward
          (BinaryOp_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  Allocator *pAVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  int iVar34;
  Mat *pMVar35;
  ulong uVar36;
  undefined8 uVar37;
  ulong uVar38;
  Mat *pMVar39;
  int iVar40;
  Mat *this_00;
  int iVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  Mat *pMVar45;
  undefined1 (*pauVar46) [16];
  int y;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  undefined1 (*pauVar50) [16];
  float *pfVar51;
  float *pfVar52;
  void *pvVar53;
  undefined1 (*pauVar54) [16];
  long lVar55;
  int iVar56;
  uint uVar57;
  float *pfVar58;
  void *pvVar59;
  float fVar60;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  __m128 afVar109;
  binary_op_pow op;
  int elempack;
  __m128 _p1;
  __m128 _a0;
  binary_op_pow local_c9;
  float *local_c8;
  float *local_c0;
  undefined1 local_b8 [16];
  float *local_a0;
  ulong local_98;
  Mat *local_90;
  Mat *local_88;
  Mat *local_80;
  ulong local_78;
  ulong local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ulong local_40;
  size_t local_38;
  
  local_b8._8_8_ = local_b8._0_8_;
  pMVar39 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar34 = pMVar39->elempack;
  iVar56 = pMVar39[1].elempack;
  if ((iVar56 != 4 && iVar34 != 4) ||
     (8 < *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3]))) {
    iVar34 = BinaryOp::forward((BinaryOp *)
                               ((long)&this->_vptr_BinaryOp_x86 + (long)this->_vptr_BinaryOp_x86[-3]
                               ),bottom_blobs,top_blobs,opt);
    return iVar34;
  }
  pMVar35 = pMVar39 + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(*(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3])) {
  case 0:
    if (3 < pMVar39->dims - 1U) {
      return 0;
    }
    local_c8 = (float *)CONCAT44(local_c8._4_4_,iVar34);
    local_b8._0_8_ = opt;
    local_c0 = (float *)CONCAT44(local_c0._4_4_,iVar56);
    uVar57 = pMVar39->w;
    uVar48 = pMVar39->h;
    iVar41 = pMVar39->d;
    uVar47 = pMVar39->c;
    uVar38 = (ulong)uVar47;
    local_a0 = (float *)CONCAT44(local_a0._4_4_,uVar48 * uVar57 * iVar41);
    sVar6 = pMVar39->elemsize;
    uVar49 = pMVar39[1].w;
    uVar4 = pMVar39[1].h;
    iVar42 = pMVar39[1].d;
    uVar3 = pMVar39[1].c;
    pMVar45 = (Mat *)(ulong)uVar3;
    iVar40 = uVar4 * uVar49 * iVar42;
    sVar5 = pMVar39[1].elemsize;
    local_98 = sVar6;
    switch(pMVar39->dims) {
    case 1:
      if (iVar34 == 1 && uVar57 == 1) {
        Mat::create_like(this_00,pMVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            uVar57 = iVar40 * (int)local_c0;
            pMVar35 = (Mat *)0x0;
            do {
              pfVar58 = (float *)(pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                                 (long)pMVar39[1].data);
              pauVar54 = (undefined1 (*) [16])
                         (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data);
              fVar60 = *pMVar39->data;
              if ((int)uVar57 < 4) {
                uVar48 = 0;
              }
              else {
                iVar34 = 3;
                do {
                  auVar107._0_4_ = *pfVar58 + fVar60;
                  auVar107._4_4_ = pfVar58[1] + fVar60;
                  auVar107._8_4_ = pfVar58[2] + fVar60;
                  auVar107._12_4_ = pfVar58[3] + fVar60;
                  *pauVar54 = auVar107;
                  pfVar58 = pfVar58 + 4;
                  pauVar54 = pauVar54 + 1;
                  iVar34 = iVar34 + 4;
                  uVar48 = uVar57 & 0xfffffffc;
                } while (iVar34 < (int)uVar57);
              }
              if (uVar57 - uVar48 != 0 && (int)uVar48 <= (int)uVar57) {
                lVar43 = 0;
                do {
                  *(float *)((long)*pauVar54 + lVar43 * 4) = pfVar58[lVar43] + fVar60;
                  lVar43 = lVar43 + 1;
                } while (uVar57 - uVar48 != (int)lVar43);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      switch(pMVar39[1].dims) {
      case 1:
        Mat::create(this_00,uVar57,sVar6,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_add>
                    (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
          return 0;
        }
LAB_003d1569:
        iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_add>
                           (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
        return iVar34;
      case 2:
        Mat::create(this_00,uVar49,uVar4,sVar5,iVar56,opt->blob_allocator);
        pauVar54 = (undefined1 (*) [16])this_00->data;
        if (pauVar54 != (undefined1 (*) [16])0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar4) {
            pfVar58 = (float *)pMVar39->data;
            pfVar51 = (float *)pMVar39[1].data;
            uVar57 = 0;
            do {
              if (0 < (int)uVar49) {
                fVar60 = *pfVar58;
                fVar1 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                uVar48 = uVar49;
                do {
                  auVar88._0_4_ = *pfVar51 + fVar60;
                  auVar88._4_4_ = pfVar51[1] + fVar1;
                  auVar88._8_4_ = pfVar51[2] + fVar32;
                  auVar88._12_4_ = pfVar51[3] + fVar33;
                  *pauVar54 = auVar88;
                  pfVar51 = pfVar51 + 4;
                  pauVar54 = pauVar54 + 1;
                  uVar48 = uVar48 - 1;
                } while (uVar48 != 0);
              }
              pfVar58 = pfVar58 + 4;
              uVar57 = uVar57 + 1;
            } while (uVar57 != uVar4);
            return 0;
          }
          return 0;
        }
        break;
      case 3:
        Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar6 = this_00->cstep;
                sVar5 = this_00->elemsize;
                pfVar58 = (float *)((long)pMVar39->data + (long)pMVar35 * 0x10);
                fVar60 = *pfVar58;
                fVar1 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                pvVar8 = this_00->data;
                sVar9 = pMVar39[1].cstep;
                sVar10 = pMVar39[1].elemsize;
                pvVar53 = pMVar39[1].data;
                lVar43 = 0;
                iVar34 = iVar40;
                do {
                  pfVar58 = (float *)((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35);
                  auVar86._0_4_ = *pfVar58 + fVar60;
                  auVar86._4_4_ = pfVar58[1] + fVar1;
                  auVar86._8_4_ = pfVar58[2] + fVar32;
                  auVar86._12_4_ = pfVar58[3] + fVar33;
                  *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35) =
                       auVar86;
                  lVar43 = lVar43 + 0x10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        break;
      case 4:
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar6 = this_00->cstep;
                sVar5 = this_00->elemsize;
                pfVar58 = (float *)((long)pMVar39->data + (long)pMVar35 * 0x10);
                fVar60 = *pfVar58;
                fVar1 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                pvVar8 = this_00->data;
                sVar9 = pMVar39[1].cstep;
                sVar10 = pMVar39[1].elemsize;
                pvVar53 = pMVar39[1].data;
                lVar43 = 0;
                iVar34 = iVar40;
                do {
                  pfVar58 = (float *)((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35);
                  auVar87._0_4_ = *pfVar58 + fVar60;
                  auVar87._4_4_ = pfVar58[1] + fVar1;
                  auVar87._8_4_ = pfVar58[2] + fVar32;
                  auVar87._12_4_ = pfVar58[3] + fVar33;
                  *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35) =
                       auVar87;
                  lVar43 = lVar43 + 0x10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        break;
      default:
LAB_003d2cdb:
        return 0;
      }
      break;
    case 2:
      pAVar7 = opt->blob_allocator;
      if (pMVar39[1].dims == 3) {
        Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,pAVar7);
        if (this_00->data != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pfVar58 = (float *)(pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                                   (long)pMVar39[1].data);
                pfVar51 = (float *)((long)pMVar39->w * (long)pMVar35 * pMVar39->elemsize +
                                   (long)pMVar39->data);
                uVar57 = 0;
                do {
                  if (0 < (int)uVar49) {
                    fVar60 = *pfVar51;
                    fVar1 = pfVar51[1];
                    fVar32 = pfVar51[2];
                    fVar33 = pfVar51[3];
                    uVar48 = uVar49;
                    do {
                      auVar73._0_4_ = *pfVar58 + fVar60;
                      auVar73._4_4_ = pfVar58[1] + fVar1;
                      auVar73._8_4_ = pfVar58[2] + fVar32;
                      auVar73._12_4_ = pfVar58[3] + fVar33;
                      *pauVar54 = auVar73;
                      pfVar58 = pfVar58 + 4;
                      pauVar54 = pauVar54 + 1;
                      uVar48 = uVar48 - 1;
                    } while (uVar48 != 0);
                  }
                  pfVar51 = pfVar51 + 4;
                  uVar57 = uVar57 + 1;
                } while (uVar57 != uVar4);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
      }
      else if (pMVar39[1].dims == 4) {
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,pAVar7);
        if (this_00->data != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar42) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pfVar58 = (float *)(pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                                   (long)pMVar39[1].data);
                pfVar51 = (float *)((long)pMVar39->w * (long)pMVar35 * pMVar39->elemsize +
                                   (long)pMVar39->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar4) {
                    fVar60 = *pfVar51;
                    fVar1 = pfVar51[1];
                    fVar32 = pfVar51[2];
                    fVar33 = pfVar51[3];
                    uVar57 = 0;
                    do {
                      uVar48 = uVar49;
                      if (0 < (int)uVar49) {
                        do {
                          auVar66._0_4_ = *pfVar58 + fVar60;
                          auVar66._4_4_ = pfVar58[1] + fVar1;
                          auVar66._8_4_ = pfVar58[2] + fVar32;
                          auVar66._12_4_ = pfVar58[3] + fVar33;
                          *pauVar54 = auVar66;
                          pfVar58 = pfVar58 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar48 = uVar48 - 1;
                        } while (uVar48 != 0);
                      }
                      uVar57 = uVar57 + 1;
                    } while (uVar57 != uVar4);
                  }
                  pfVar51 = pfVar51 + 4;
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar42);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
      }
      else {
        Mat::create(this_00,uVar57,uVar48,sVar6,iVar34,pAVar7);
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if (pMVar39[1].dims != 1) {
            if (pMVar39[1].dims != 2) {
              return 0;
            }
            goto LAB_003ccb94;
          }
          Mat::create(this_00,uVar57,uVar48,sVar6,(int)local_c8,*(Allocator **)(local_b8._0_8_ + 8))
          ;
          pauVar54 = (undefined1 (*) [16])this_00->data;
          if (pauVar54 != (undefined1 (*) [16])0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
              if (0 < (int)uVar48) {
                pfVar58 = (float *)pMVar39->data;
                pfVar51 = (float *)pMVar39[1].data;
                uVar47 = 0;
                do {
                  if (0 < (int)uVar57) {
                    fVar60 = *pfVar51;
                    fVar1 = pfVar51[1];
                    fVar32 = pfVar51[2];
                    fVar33 = pfVar51[3];
                    uVar49 = uVar57;
                    do {
                      auVar104._0_4_ = *pfVar58 + fVar60;
                      auVar104._4_4_ = pfVar58[1] + fVar1;
                      auVar104._8_4_ = pfVar58[2] + fVar32;
                      auVar104._12_4_ = pfVar58[3] + fVar33;
                      *pauVar54 = auVar104;
                      pfVar58 = pfVar58 + 4;
                      pauVar54 = pauVar54 + 1;
                      uVar49 = uVar49 - 1;
                    } while (uVar49 != 0);
                  }
                  pfVar51 = pfVar51 + 4;
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar48);
                return 0;
              }
              return 0;
            }
            goto LAB_003d1569;
          }
        }
      }
      break;
    case 3:
      if (pMVar39[1].dims == 3) {
        if (uVar3 == uVar47 && (uVar4 == 1 && (uVar49 ^ 1) == 0)) {
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data != (void *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar47) {
              uVar36 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  pfVar58 = (float *)((long)pMVar39[1].data +
                                     pMVar39[1].cstep * uVar36 * pMVar39[1].elemsize);
                  fVar60 = *pfVar58;
                  fVar1 = pfVar58[1];
                  fVar32 = pfVar58[2];
                  fVar33 = pfVar58[3];
                  pvVar8 = this_00->data;
                  sVar9 = pMVar39->cstep;
                  sVar10 = pMVar39->elemsize;
                  pvVar53 = pMVar39->data;
                  lVar43 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    pfVar58 = (float *)((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36);
                    auVar71._0_4_ = *pfVar58 + fVar60;
                    auVar71._4_4_ = pfVar58[1] + fVar1;
                    auVar71._8_4_ = pfVar58[2] + fVar32;
                    auVar71._12_4_ = pfVar58[3] + fVar33;
                    *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36) = auVar71
                    ;
                    lVar43 = lVar43 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar38);
              return 0;
            }
            return 0;
          }
        }
        else if ((uVar49 == uVar57) && (iVar56 == 1 && (uVar3 == 1 && uVar4 == uVar48))) {
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data != (void *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar47) {
              uVar36 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  sVar9 = pMVar39->cstep;
                  pvVar8 = this_00->data;
                  pvVar53 = pMVar39[1].data;
                  sVar10 = pMVar39->elemsize;
                  pvVar59 = pMVar39->data;
                  lVar43 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    pfVar58 = (float *)((long)pvVar59 + lVar43 * 4 + sVar9 * sVar10 * uVar36);
                    fVar60 = *(float *)((long)pvVar53 + lVar43);
                    auVar78._0_4_ = fVar60 + *pfVar58;
                    auVar78._4_4_ = fVar60 + pfVar58[1];
                    auVar78._8_4_ = fVar60 + pfVar58[2];
                    auVar78._12_4_ = fVar60 + pfVar58[3];
                    *(undefined1 (*) [16])((long)pvVar8 + lVar43 * 4 + sVar6 * sVar5 * uVar36) =
                         auVar78;
                    lVar43 = lVar43 + 4;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar38);
              return 0;
            }
            return 0;
          }
        }
        else {
          local_a0 = (float *)sVar5;
          if ((uVar48 == 1 && (uVar57 ^ 1) == 0) && uVar47 == uVar3) {
            Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
            if (this_00->data != (void *)0x0) {
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if (0 < (int)uVar3) {
                pMVar35 = (Mat *)0x0;
                do {
                  if (0 < iVar40) {
                    sVar6 = pMVar39[1].cstep;
                    sVar5 = pMVar39[1].elemsize;
                    pfVar58 = (float *)((long)pMVar39->data +
                                       pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize);
                    fVar60 = *pfVar58;
                    fVar1 = pfVar58[1];
                    fVar32 = pfVar58[2];
                    fVar33 = pfVar58[3];
                    pvVar8 = pMVar39[1].data;
                    sVar9 = this_00->cstep;
                    sVar10 = this_00->elemsize;
                    pvVar53 = this_00->data;
                    lVar43 = 0;
                    iVar34 = iVar40;
                    do {
                      pfVar58 = (float *)((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35);
                      auVar82._0_4_ = *pfVar58 + fVar60;
                      auVar82._4_4_ = pfVar58[1] + fVar1;
                      auVar82._8_4_ = pfVar58[2] + fVar32;
                      auVar82._12_4_ = pfVar58[3] + fVar33;
                      *(undefined1 (*) [16])
                       ((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35) = auVar82;
                      lVar43 = lVar43 + 0x10;
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                  }
                  pMVar35 = (Mat *)((long)&pMVar35->data + 1);
                } while (pMVar35 != pMVar45);
                return 0;
              }
              return 0;
            }
          }
          else if ((((uVar49 == uVar57) && (iVar34 == 1)) && (uVar4 == uVar48)) && (uVar47 == 1)) {
            Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
            if (this_00->data != (void *)0x0) {
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if (0 < (int)uVar3) {
                pMVar35 = (Mat *)0x0;
                do {
                  if (0 < iVar40) {
                    sVar6 = this_00->cstep;
                    sVar5 = this_00->elemsize;
                    pvVar8 = pMVar39->data;
                    pvVar53 = this_00->data;
                    sVar9 = pMVar39[1].cstep;
                    sVar10 = pMVar39[1].elemsize;
                    pvVar59 = pMVar39[1].data;
                    lVar43 = 0;
                    iVar34 = iVar40;
                    do {
                      fVar60 = *(float *)((long)pvVar8 + lVar43);
                      pfVar58 = (float *)((long)pvVar59 +
                                         lVar43 * 4 + sVar9 * sVar10 * (long)pMVar35);
                      auVar90._0_4_ = *pfVar58 + fVar60;
                      auVar90._4_4_ = pfVar58[1] + fVar60;
                      auVar90._8_4_ = pfVar58[2] + fVar60;
                      auVar90._12_4_ = pfVar58[3] + fVar60;
                      *(undefined1 (*) [16])
                       ((long)pvVar53 + lVar43 * 4 + sVar6 * sVar5 * (long)pMVar35) = auVar90;
                      lVar43 = lVar43 + 4;
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                  }
                  pMVar35 = (Mat *)((long)&pMVar35->data + 1);
                } while (pMVar35 != pMVar45);
                return 0;
              }
              return 0;
            }
          }
          else if ((((uVar49 ^ 1) == 0 && uVar4 == uVar48) && uVar47 == uVar3) && uVar57 != 1) {
            Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
            if (this_00->data != (void *)0x0) {
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if (0 < (int)uVar3) {
                pMVar35 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar48) {
                    sVar6 = pMVar39[1].cstep;
                    sVar5 = pMVar39[1].elemsize;
                    pvVar8 = pMVar39[1].data;
                    pauVar54 = (undefined1 (*) [16])
                               (this_00->cstep * (long)pMVar35 * this_00->elemsize +
                               (long)this_00->data);
                    pfVar58 = (float *)(pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize +
                                       (long)pMVar39->data);
                    uVar38 = 0;
                    do {
                      if (0 < (int)uVar57) {
                        pfVar51 = (float *)((long)pvVar8 +
                                           uVar38 * 0x10 + sVar6 * (long)pMVar35 * sVar5);
                        fVar60 = *pfVar51;
                        fVar1 = pfVar51[1];
                        fVar32 = pfVar51[2];
                        fVar33 = pfVar51[3];
                        uVar47 = uVar57;
                        do {
                          auVar94._0_4_ = *pfVar58 + fVar60;
                          auVar94._4_4_ = pfVar58[1] + fVar1;
                          auVar94._8_4_ = pfVar58[2] + fVar32;
                          auVar94._12_4_ = pfVar58[3] + fVar33;
                          *pauVar54 = auVar94;
                          pfVar58 = pfVar58 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar47 = uVar47 - 1;
                        } while (uVar47 != 0);
                      }
                      uVar38 = uVar38 + 1;
                    } while (uVar38 != uVar48);
                  }
                  pMVar35 = (Mat *)((long)&pMVar35->data + 1);
                } while (pMVar35 != pMVar45);
                return 0;
              }
              return 0;
            }
          }
          else {
            local_90 = pMVar45;
            if (((uVar4 == 1 && (uVar49 ^ uVar57) == 0) && uVar3 == uVar47) && uVar48 != 1) {
              local_88 = pMVar39;
              Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
              if (this_00->data != (void *)0x0) {
                if ((long)this_00->c * this_00->cstep == 0) {
                  return -100;
                }
                if (0 < (int)local_90) {
                  pMVar39 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar48) {
                      sVar6 = local_88[1].elemsize;
                      pvVar53 = (void *)(this_00->cstep * (long)pMVar39 * this_00->elemsize +
                                        (long)this_00->data);
                      pvVar59 = (void *)(local_88->cstep * (long)pMVar39 * local_88->elemsize +
                                        (long)local_88->data);
                      sVar5 = local_88[1].cstep;
                      pvVar8 = local_88[1].data;
                      uVar47 = 0;
                      do {
                        if (0 < (int)uVar57) {
                          lVar43 = 0;
                          do {
                            pfVar58 = (float *)((long)pvVar59 + lVar43);
                            pfVar51 = (float *)((long)pvVar8 +
                                               lVar43 + sVar6 * sVar5 * (long)pMVar39);
                            auVar100._0_4_ = *pfVar51 + *pfVar58;
                            auVar100._4_4_ = pfVar51[1] + pfVar58[1];
                            auVar100._8_4_ = pfVar51[2] + pfVar58[2];
                            auVar100._12_4_ = pfVar51[3] + pfVar58[3];
                            *(undefined1 (*) [16])((long)pvVar53 + lVar43) = auVar100;
                            lVar43 = lVar43 + 0x10;
                          } while ((ulong)uVar57 << 4 != lVar43);
                          pvVar53 = (void *)((long)pvVar53 + lVar43);
                          pvVar59 = (void *)((long)pvVar59 + lVar43);
                        }
                        uVar47 = uVar47 + 1;
                      } while (uVar47 != uVar48);
                    }
                    pMVar39 = (Mat *)((long)&pMVar39->data + 1);
                  } while (pMVar39 != local_90);
                  return 0;
                }
                return 0;
              }
            }
            else if ((((uVar57 ^ 1) == 0 && uVar48 == uVar4) && uVar3 == uVar47) && uVar49 != 1) {
              local_88 = pMVar39;
              Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
              if (this_00->data != (void *)0x0) {
                if ((long)this_00->c * this_00->cstep == 0) {
                  return -100;
                }
                if (0 < (int)local_90) {
                  pMVar39 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar4) {
                      sVar6 = local_88->cstep;
                      sVar5 = local_88->elemsize;
                      pvVar8 = local_88->data;
                      pauVar54 = (undefined1 (*) [16])
                                 (this_00->cstep * (long)pMVar39 * this_00->elemsize +
                                 (long)this_00->data);
                      pfVar58 = (float *)(local_88[1].cstep * (long)pMVar39 * local_88[1].elemsize +
                                         (long)local_88[1].data);
                      uVar38 = 0;
                      do {
                        if (0 < (int)uVar49) {
                          pfVar51 = (float *)((long)pvVar8 +
                                             uVar38 * 0x10 + sVar6 * (long)pMVar39 * sVar5);
                          fVar60 = *pfVar51;
                          fVar1 = pfVar51[1];
                          fVar32 = pfVar51[2];
                          fVar33 = pfVar51[3];
                          uVar57 = uVar49;
                          do {
                            auVar102._0_4_ = *pfVar58 + fVar60;
                            auVar102._4_4_ = pfVar58[1] + fVar1;
                            auVar102._8_4_ = pfVar58[2] + fVar32;
                            auVar102._12_4_ = pfVar58[3] + fVar33;
                            *pauVar54 = auVar102;
                            pfVar58 = pfVar58 + 4;
                            pauVar54 = pauVar54 + 1;
                            uVar57 = uVar57 - 1;
                          } while (uVar57 != 0);
                        }
                        uVar38 = uVar38 + 1;
                      } while (uVar38 != uVar4);
                    }
                    pMVar39 = (Mat *)((long)&pMVar39->data + 1);
                  } while (pMVar39 != local_90);
                  return 0;
                }
                return 0;
              }
            }
            else {
              local_88 = pMVar39;
              if ((((uVar49 ^ uVar57) != 0 || uVar48 != 1) || uVar47 != uVar3) || uVar4 == 1)
              goto LAB_003ccb94;
              Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
              if (this_00->data != (void *)0x0) {
                if ((long)this_00->c * this_00->cstep == 0) {
                  return -100;
                }
                if (0 < (int)local_90) {
                  pMVar39 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar4) {
                      sVar6 = local_88->elemsize;
                      pvVar53 = (void *)(this_00->cstep * (long)pMVar39 * this_00->elemsize +
                                        (long)this_00->data);
                      pvVar59 = (void *)(local_88[1].cstep * (long)pMVar39 * local_88[1].elemsize +
                                        (long)local_88[1].data);
                      sVar5 = local_88->cstep;
                      pvVar8 = local_88->data;
                      uVar57 = 0;
                      do {
                        if (0 < (int)uVar49) {
                          lVar43 = 0;
                          do {
                            pfVar58 = (float *)((long)pvVar8 +
                                               lVar43 + sVar6 * sVar5 * (long)pMVar39);
                            pfVar51 = (float *)((long)pvVar59 + lVar43);
                            auVar106._0_4_ = *pfVar51 + *pfVar58;
                            auVar106._4_4_ = pfVar51[1] + pfVar58[1];
                            auVar106._8_4_ = pfVar51[2] + pfVar58[2];
                            auVar106._12_4_ = pfVar51[3] + pfVar58[3];
                            *(undefined1 (*) [16])((long)pvVar53 + lVar43) = auVar106;
                            lVar43 = lVar43 + 0x10;
                          } while ((ulong)uVar49 << 4 != lVar43);
                          pvVar53 = (void *)((long)pvVar53 + lVar43);
                          pvVar59 = (void *)((long)pvVar59 + lVar43);
                        }
                        uVar57 = uVar57 + 1;
                      } while (uVar57 != uVar4);
                    }
                    pMVar39 = (Mat *)((long)&pMVar39->data + 1);
                  } while (pMVar39 != local_90);
                  return 0;
                }
                return 0;
              }
            }
          }
        }
      }
      else if (pMVar39[1].dims == 4) {
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar42) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pfVar58 = (float *)(pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                                   (long)pMVar39[1].data);
                pfVar51 = (float *)(pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize +
                                   (long)pMVar39->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar4) {
                    uVar57 = 0;
                    do {
                      if (0 < (int)uVar49) {
                        fVar60 = *pfVar51;
                        fVar1 = pfVar51[1];
                        fVar32 = pfVar51[2];
                        fVar33 = pfVar51[3];
                        uVar48 = uVar49;
                        do {
                          auVar64._0_4_ = *pfVar58 + fVar60;
                          auVar64._4_4_ = pfVar58[1] + fVar1;
                          auVar64._8_4_ = pfVar58[2] + fVar32;
                          auVar64._12_4_ = pfVar58[3] + fVar33;
                          *pauVar54 = auVar64;
                          pfVar58 = pfVar58 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar48 = uVar48 - 1;
                        } while (uVar48 != 0);
                      }
                      pfVar51 = pfVar51 + 4;
                      uVar57 = uVar57 + 1;
                    } while (uVar57 != uVar4);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar42);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
      }
      else {
        Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
        if (this_00->data != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar39[1].dims != 1) {
            if (pMVar39[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar47) {
              uVar36 = 0;
              do {
                if (0 < (int)uVar48) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pfVar51 = (float *)((long)pMVar39[1].w * uVar36 * pMVar39[1].elemsize +
                                     (long)pMVar39[1].data);
                  pfVar58 = (float *)(pMVar39->cstep * uVar36 * pMVar39->elemsize +
                                     (long)pMVar39->data);
                  uVar47 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      fVar60 = *pfVar51;
                      fVar1 = pfVar51[1];
                      fVar32 = pfVar51[2];
                      fVar33 = pfVar51[3];
                      uVar49 = uVar57;
                      do {
                        auVar75._0_4_ = *pfVar58 + fVar60;
                        auVar75._4_4_ = pfVar58[1] + fVar1;
                        auVar75._8_4_ = pfVar58[2] + fVar32;
                        auVar75._12_4_ = pfVar58[3] + fVar33;
                        *pauVar54 = auVar75;
                        pfVar58 = pfVar58 + 4;
                        pauVar54 = pauVar54 + 1;
                        uVar49 = uVar49 - 1;
                      } while (uVar49 != 0);
                    }
                    pfVar51 = pfVar51 + 4;
                    uVar47 = uVar47 + 1;
                  } while (uVar47 != uVar48);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar38);
              return 0;
            }
            return 0;
          }
          if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
            if (0 < (int)uVar47) {
              uVar36 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  pfVar58 = (float *)((long)pMVar35->data + uVar36 * 0x10);
                  fVar60 = *pfVar58;
                  fVar1 = pfVar58[1];
                  fVar32 = pfVar58[2];
                  fVar33 = pfVar58[3];
                  pvVar8 = this_00->data;
                  sVar9 = pMVar39->cstep;
                  sVar10 = pMVar39->elemsize;
                  pvVar53 = pMVar39->data;
                  lVar43 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    pfVar58 = (float *)((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36);
                    auVar96._0_4_ = *pfVar58 + fVar60;
                    auVar96._4_4_ = pfVar58[1] + fVar1;
                    auVar96._8_4_ = pfVar58[2] + fVar32;
                    auVar96._12_4_ = pfVar58[3] + fVar33;
                    *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36) = auVar96
                    ;
                    lVar43 = lVar43 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar38);
              return 0;
            }
            return 0;
          }
          goto LAB_003d1569;
        }
      }
      break;
    case 4:
      if (pMVar39[1].dims == 4) {
LAB_003ccb94:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_add>
                           (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
        return iVar34;
      }
      local_90 = pMVar35;
      Mat::create(this_00,uVar57,uVar48,iVar41,uVar47,sVar6,iVar34,opt->blob_allocator);
      if (this_00->data != (void *)0x0) {
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = pMVar39[1].dims;
        if (iVar34 != 1) {
          if (iVar34 == 3) {
            if (0 < (int)uVar47) {
              uVar36 = 0;
              do {
                if (0 < iVar41) {
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                  pfVar51 = (float *)(pMVar39[1].cstep * uVar36 * pMVar39[1].elemsize +
                                     (long)pMVar39[1].data);
                  pfVar58 = (float *)(pMVar39->cstep * uVar36 * pMVar39->elemsize +
                                     (long)pMVar39->data);
                  iVar34 = 0;
                  do {
                    if (0 < (int)uVar48) {
                      uVar47 = 0;
                      do {
                        if (0 < (int)uVar57) {
                          fVar60 = *pfVar51;
                          fVar1 = pfVar51[1];
                          fVar32 = pfVar51[2];
                          fVar33 = pfVar51[3];
                          uVar49 = uVar57;
                          do {
                            auVar92._0_4_ = *pfVar58 + fVar60;
                            auVar92._4_4_ = pfVar58[1] + fVar1;
                            auVar92._8_4_ = pfVar58[2] + fVar32;
                            auVar92._12_4_ = pfVar58[3] + fVar33;
                            *pauVar54 = auVar92;
                            pfVar58 = pfVar58 + 4;
                            pauVar54 = pauVar54 + 1;
                            uVar49 = uVar49 - 1;
                          } while (uVar49 != 0);
                        }
                        pfVar51 = pfVar51 + 4;
                        uVar47 = uVar47 + 1;
                      } while (uVar47 != uVar48);
                    }
                    iVar34 = iVar34 + 1;
                  } while (iVar34 != iVar41);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar38);
              return 0;
            }
            return 0;
          }
          if (iVar34 != 2) {
            return 0;
          }
          if (0 < (int)uVar47) {
            uVar36 = 0;
            do {
              if (0 < iVar41) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                pfVar51 = (float *)((long)pMVar39[1].w * uVar36 * pMVar39[1].elemsize +
                                   (long)pMVar39[1].data);
                pfVar58 = (float *)(pMVar39->cstep * uVar36 * pMVar39->elemsize +
                                   (long)pMVar39->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar48) {
                    fVar60 = *pfVar51;
                    fVar1 = pfVar51[1];
                    fVar32 = pfVar51[2];
                    fVar33 = pfVar51[3];
                    uVar47 = 0;
                    do {
                      uVar49 = uVar57;
                      if (0 < (int)uVar57) {
                        do {
                          auVar68._0_4_ = *pfVar58 + fVar60;
                          auVar68._4_4_ = pfVar58[1] + fVar1;
                          auVar68._8_4_ = pfVar58[2] + fVar32;
                          auVar68._12_4_ = pfVar58[3] + fVar33;
                          *pauVar54 = auVar68;
                          pfVar58 = pfVar58 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar49 = uVar49 - 1;
                        } while (uVar49 != 0);
                      }
                      uVar47 = uVar47 + 1;
                    } while (uVar47 != uVar48);
                  }
                  pfVar51 = pfVar51 + 4;
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar41);
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 != uVar38);
            return 0;
          }
          return 0;
        }
        pMVar35 = local_90;
        if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
          if (0 < (int)uVar47) {
            uVar36 = 0;
            do {
              if (0 < (int)local_a0) {
                sVar6 = pMVar39->cstep;
                sVar5 = pMVar39->elemsize;
                pfVar58 = (float *)((long)local_90->data + uVar36 * 0x10);
                fVar60 = *pfVar58;
                fVar1 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                pvVar8 = pMVar39->data;
                sVar9 = this_00->cstep;
                sVar10 = this_00->elemsize;
                pvVar53 = this_00->data;
                lVar43 = 0;
                iVar34 = (int)local_a0;
                do {
                  pfVar58 = (float *)((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36);
                  auVar98._0_4_ = *pfVar58 + fVar60;
                  auVar98._4_4_ = pfVar58[1] + fVar1;
                  auVar98._8_4_ = pfVar58[2] + fVar32;
                  auVar98._12_4_ = pfVar58[3] + fVar33;
                  *(undefined1 (*) [16])((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36) = auVar98
                  ;
                  lVar43 = lVar43 + 0x10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 != uVar38);
            return 0;
          }
          return 0;
        }
        goto LAB_003d1569;
      }
    }
    return -100;
  case 1:
    pMVar45 = pMVar35;
    break;
  case 2:
    if (3 < pMVar39->dims - 1U) {
      return 0;
    }
    local_c8 = (float *)CONCAT44(local_c8._4_4_,iVar34);
    local_b8._0_8_ = opt;
    local_c0 = (float *)CONCAT44(local_c0._4_4_,iVar56);
    uVar57 = pMVar39->w;
    uVar48 = pMVar39->h;
    iVar41 = pMVar39->d;
    uVar47 = pMVar39->c;
    uVar38 = (ulong)uVar47;
    local_a0 = (float *)CONCAT44(local_a0._4_4_,uVar48 * uVar57 * iVar41);
    sVar6 = pMVar39->elemsize;
    uVar49 = pMVar39[1].w;
    uVar4 = pMVar39[1].h;
    iVar42 = pMVar39[1].d;
    uVar3 = pMVar39[1].c;
    pMVar45 = (Mat *)(ulong)uVar3;
    iVar40 = uVar4 * uVar49 * iVar42;
    sVar5 = pMVar39[1].elemsize;
    local_98 = sVar6;
    switch(pMVar39->dims) {
    case 1:
      if (iVar34 == 1 && uVar57 == 1) {
        Mat::create_like(this_00,pMVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            uVar57 = iVar40 * (int)local_c0;
            pMVar35 = (Mat *)0x0;
            do {
              pfVar58 = (float *)(pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                                 (long)pMVar39[1].data);
              pauVar54 = (undefined1 (*) [16])
                         (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data);
              fVar60 = *pMVar39->data;
              if ((int)uVar57 < 4) {
                uVar48 = 0;
              }
              else {
                iVar34 = 3;
                do {
                  auVar108._0_4_ = *pfVar58 * fVar60;
                  auVar108._4_4_ = pfVar58[1] * fVar60;
                  auVar108._8_4_ = pfVar58[2] * fVar60;
                  auVar108._12_4_ = pfVar58[3] * fVar60;
                  *pauVar54 = auVar108;
                  pfVar58 = pfVar58 + 4;
                  pauVar54 = pauVar54 + 1;
                  iVar34 = iVar34 + 4;
                  uVar48 = uVar57 & 0xfffffffc;
                } while (iVar34 < (int)uVar57);
              }
              if (uVar57 - uVar48 != 0 && (int)uVar48 <= (int)uVar57) {
                lVar43 = 0;
                do {
                  *(float *)((long)*pauVar54 + lVar43 * 4) = pfVar58[lVar43] * fVar60;
                  lVar43 = lVar43 + 1;
                } while (uVar57 - uVar48 != (int)lVar43);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      switch(pMVar39[1].dims) {
      case 1:
        Mat::create(this_00,uVar57,sVar6,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_mul>
                    (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
          return 0;
        }
        break;
      case 2:
        Mat::create(this_00,uVar49,uVar4,sVar5,iVar56,opt->blob_allocator);
        pauVar54 = (undefined1 (*) [16])this_00->data;
        if (pauVar54 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar4) {
            pfVar58 = (float *)pMVar39->data;
            pfVar51 = (float *)pMVar39[1].data;
            uVar57 = 0;
            do {
              if (0 < (int)uVar49) {
                fVar60 = *pfVar58;
                fVar1 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                uVar48 = uVar49;
                do {
                  auVar85._0_4_ = *pfVar51 * fVar60;
                  auVar85._4_4_ = pfVar51[1] * fVar1;
                  auVar85._8_4_ = pfVar51[2] * fVar32;
                  auVar85._12_4_ = pfVar51[3] * fVar33;
                  *pauVar54 = auVar85;
                  pfVar51 = pfVar51 + 4;
                  pauVar54 = pauVar54 + 1;
                  uVar48 = uVar48 - 1;
                } while (uVar48 != 0);
              }
              pfVar58 = pfVar58 + 4;
              uVar57 = uVar57 + 1;
            } while (uVar57 != uVar4);
            return 0;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar6 = this_00->cstep;
                sVar5 = this_00->elemsize;
                pfVar58 = (float *)((long)pMVar39->data + (long)pMVar35 * 0x10);
                fVar60 = *pfVar58;
                fVar1 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                pvVar8 = this_00->data;
                sVar9 = pMVar39[1].cstep;
                sVar10 = pMVar39[1].elemsize;
                pvVar53 = pMVar39[1].data;
                lVar43 = 0;
                iVar34 = iVar40;
                do {
                  pfVar58 = (float *)((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35);
                  auVar83._0_4_ = *pfVar58 * fVar60;
                  auVar83._4_4_ = pfVar58[1] * fVar1;
                  auVar83._8_4_ = pfVar58[2] * fVar32;
                  auVar83._12_4_ = pfVar58[3] * fVar33;
                  *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35) =
                       auVar83;
                  lVar43 = lVar43 + 0x10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar6 = this_00->cstep;
                sVar5 = this_00->elemsize;
                pfVar58 = (float *)((long)pMVar39->data + (long)pMVar35 * 0x10);
                fVar60 = *pfVar58;
                fVar1 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                pvVar8 = this_00->data;
                sVar9 = pMVar39[1].cstep;
                sVar10 = pMVar39[1].elemsize;
                pvVar53 = pMVar39[1].data;
                lVar43 = 0;
                iVar34 = iVar40;
                do {
                  pfVar58 = (float *)((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35);
                  auVar84._0_4_ = *pfVar58 * fVar60;
                  auVar84._4_4_ = pfVar58[1] * fVar1;
                  auVar84._8_4_ = pfVar58[2] * fVar32;
                  auVar84._12_4_ = pfVar58[3] * fVar33;
                  *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35) =
                       auVar84;
                  lVar43 = lVar43 + 0x10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      default:
        goto LAB_003d2cdb;
      }
      break;
    case 2:
      pAVar7 = opt->blob_allocator;
      if (pMVar39[1].dims == 3) {
        Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pfVar58 = (float *)(pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                                   (long)pMVar39[1].data);
                pfVar51 = (float *)((long)pMVar39->w * (long)pMVar35 * pMVar39->elemsize +
                                   (long)pMVar39->data);
                uVar57 = 0;
                do {
                  if (0 < (int)uVar49) {
                    fVar60 = *pfVar51;
                    fVar1 = pfVar51[1];
                    fVar32 = pfVar51[2];
                    fVar33 = pfVar51[3];
                    uVar48 = uVar49;
                    do {
                      auVar72._0_4_ = *pfVar58 * fVar60;
                      auVar72._4_4_ = pfVar58[1] * fVar1;
                      auVar72._8_4_ = pfVar58[2] * fVar32;
                      auVar72._12_4_ = pfVar58[3] * fVar33;
                      *pauVar54 = auVar72;
                      pfVar58 = pfVar58 + 4;
                      pauVar54 = pauVar54 + 1;
                      uVar48 = uVar48 - 1;
                    } while (uVar48 != 0);
                  }
                  pfVar51 = pfVar51 + 4;
                  uVar57 = uVar57 + 1;
                } while (uVar57 != uVar4);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pMVar39[1].dims == 4) {
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar42) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pfVar58 = (float *)(pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                                   (long)pMVar39[1].data);
                pfVar51 = (float *)((long)pMVar39->w * (long)pMVar35 * pMVar39->elemsize +
                                   (long)pMVar39->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar4) {
                    fVar60 = *pfVar51;
                    fVar1 = pfVar51[1];
                    fVar32 = pfVar51[2];
                    fVar33 = pfVar51[3];
                    uVar57 = 0;
                    do {
                      uVar48 = uVar49;
                      if (0 < (int)uVar49) {
                        do {
                          auVar65._0_4_ = *pfVar58 * fVar60;
                          auVar65._4_4_ = pfVar58[1] * fVar1;
                          auVar65._8_4_ = pfVar58[2] * fVar32;
                          auVar65._12_4_ = pfVar58[3] * fVar33;
                          *pauVar54 = auVar65;
                          pfVar58 = pfVar58 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar48 = uVar48 - 1;
                        } while (uVar48 != 0);
                      }
                      uVar57 = uVar57 + 1;
                    } while (uVar57 != uVar4);
                  }
                  pfVar51 = pfVar51 + 4;
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar42);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar57,uVar48,sVar6,iVar34,pAVar7);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar39[1].dims != 1) {
        if (pMVar39[1].dims != 2) {
          return 0;
        }
LAB_003cc95f:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_mul>
                           (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
        return iVar34;
      }
      Mat::create(this_00,uVar57,uVar48,sVar6,(int)local_c8,*(Allocator **)(local_b8._0_8_ + 8));
      pauVar54 = (undefined1 (*) [16])this_00->data;
      if (pauVar54 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
        if (0 < (int)uVar48) {
          pfVar58 = (float *)pMVar39->data;
          pfVar51 = (float *)pMVar39[1].data;
          uVar47 = 0;
          do {
            if (0 < (int)uVar57) {
              fVar60 = *pfVar51;
              fVar1 = pfVar51[1];
              fVar32 = pfVar51[2];
              fVar33 = pfVar51[3];
              uVar49 = uVar57;
              do {
                auVar103._0_4_ = *pfVar58 * fVar60;
                auVar103._4_4_ = pfVar58[1] * fVar1;
                auVar103._8_4_ = pfVar58[2] * fVar32;
                auVar103._12_4_ = pfVar58[3] * fVar33;
                *pauVar54 = auVar103;
                pfVar58 = pfVar58 + 4;
                pauVar54 = pauVar54 + 1;
                uVar49 = uVar49 - 1;
              } while (uVar49 != 0);
            }
            pfVar51 = pfVar51 + 4;
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar48);
          return 0;
        }
        return 0;
      }
      break;
    case 3:
      if (pMVar39[1].dims == 3) {
        if (uVar3 == uVar47 && (uVar4 == 1 && (uVar49 ^ 1) == 0)) {
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar47) {
              uVar36 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  pfVar58 = (float *)((long)pMVar39[1].data +
                                     pMVar39[1].cstep * uVar36 * pMVar39[1].elemsize);
                  fVar60 = *pfVar58;
                  fVar1 = pfVar58[1];
                  fVar32 = pfVar58[2];
                  fVar33 = pfVar58[3];
                  pvVar8 = this_00->data;
                  sVar9 = pMVar39->cstep;
                  sVar10 = pMVar39->elemsize;
                  pvVar53 = pMVar39->data;
                  lVar43 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    pfVar58 = (float *)((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36);
                    auVar70._0_4_ = *pfVar58 * fVar60;
                    auVar70._4_4_ = pfVar58[1] * fVar1;
                    auVar70._8_4_ = pfVar58[2] * fVar32;
                    auVar70._12_4_ = pfVar58[3] * fVar33;
                    *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36) = auVar70
                    ;
                    lVar43 = lVar43 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar38);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar49 == uVar57) && (iVar56 == 1 && (uVar3 == 1 && uVar4 == uVar48))) {
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar47) {
              uVar36 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  sVar9 = pMVar39->cstep;
                  pvVar8 = this_00->data;
                  pvVar53 = pMVar39[1].data;
                  sVar10 = pMVar39->elemsize;
                  pvVar59 = pMVar39->data;
                  lVar43 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    pfVar58 = (float *)((long)pvVar59 + lVar43 * 4 + sVar9 * sVar10 * uVar36);
                    fVar60 = *(float *)((long)pvVar53 + lVar43);
                    auVar77._0_4_ = fVar60 * *pfVar58;
                    auVar77._4_4_ = fVar60 * pfVar58[1];
                    auVar77._8_4_ = fVar60 * pfVar58[2];
                    auVar77._12_4_ = fVar60 * pfVar58[3];
                    *(undefined1 (*) [16])((long)pvVar8 + lVar43 * 4 + sVar6 * sVar5 * uVar36) =
                         auVar77;
                    lVar43 = lVar43 + 4;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar38);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_a0 = (float *)sVar5;
        if ((uVar48 == 1 && (uVar57 ^ 1) == 0) && uVar47 == uVar3) {
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pMVar35 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar6 = pMVar39[1].cstep;
                  sVar5 = pMVar39[1].elemsize;
                  pfVar58 = (float *)((long)pMVar39->data +
                                     pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize);
                  fVar60 = *pfVar58;
                  fVar1 = pfVar58[1];
                  fVar32 = pfVar58[2];
                  fVar33 = pfVar58[3];
                  pvVar8 = pMVar39[1].data;
                  sVar9 = this_00->cstep;
                  sVar10 = this_00->elemsize;
                  pvVar53 = this_00->data;
                  lVar43 = 0;
                  iVar34 = iVar40;
                  do {
                    pfVar58 = (float *)((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35);
                    auVar81._0_4_ = *pfVar58 * fVar60;
                    auVar81._4_4_ = pfVar58[1] * fVar1;
                    auVar81._8_4_ = pfVar58[2] * fVar32;
                    auVar81._12_4_ = pfVar58[3] * fVar33;
                    *(undefined1 (*) [16])((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35)
                         = auVar81;
                    lVar43 = lVar43 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                pMVar35 = (Mat *)((long)&pMVar35->data + 1);
              } while (pMVar35 != pMVar45);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar49 == uVar57) && (iVar34 == 1)) && ((uVar4 == uVar48 && (uVar47 == 1)))) {
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pMVar35 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  pvVar8 = pMVar39->data;
                  pvVar53 = this_00->data;
                  sVar9 = pMVar39[1].cstep;
                  sVar10 = pMVar39[1].elemsize;
                  pvVar59 = pMVar39[1].data;
                  lVar43 = 0;
                  iVar34 = iVar40;
                  do {
                    fVar60 = *(float *)((long)pvVar8 + lVar43);
                    pfVar58 = (float *)((long)pvVar59 + lVar43 * 4 + sVar9 * sVar10 * (long)pMVar35)
                    ;
                    auVar89._0_4_ = *pfVar58 * fVar60;
                    auVar89._4_4_ = pfVar58[1] * fVar60;
                    auVar89._8_4_ = pfVar58[2] * fVar60;
                    auVar89._12_4_ = pfVar58[3] * fVar60;
                    *(undefined1 (*) [16])
                     ((long)pvVar53 + lVar43 * 4 + sVar6 * sVar5 * (long)pMVar35) = auVar89;
                    lVar43 = lVar43 + 4;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                pMVar35 = (Mat *)((long)&pMVar35->data + 1);
              } while (pMVar35 != pMVar45);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar49 ^ 1) == 0 && uVar4 == uVar48) && uVar47 == uVar3) && uVar57 != 1) {
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pMVar35 = (Mat *)0x0;
              do {
                if (0 < (int)uVar48) {
                  sVar6 = pMVar39[1].cstep;
                  sVar5 = pMVar39[1].elemsize;
                  pvVar8 = pMVar39[1].data;
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * (long)pMVar35 * this_00->elemsize +
                             (long)this_00->data);
                  pfVar58 = (float *)(pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize +
                                     (long)pMVar39->data);
                  uVar38 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      pfVar51 = (float *)((long)pvVar8 +
                                         uVar38 * 0x10 + sVar6 * (long)pMVar35 * sVar5);
                      fVar60 = *pfVar51;
                      fVar1 = pfVar51[1];
                      fVar32 = pfVar51[2];
                      fVar33 = pfVar51[3];
                      uVar47 = uVar57;
                      do {
                        auVar93._0_4_ = *pfVar58 * fVar60;
                        auVar93._4_4_ = pfVar58[1] * fVar1;
                        auVar93._8_4_ = pfVar58[2] * fVar32;
                        auVar93._12_4_ = pfVar58[3] * fVar33;
                        *pauVar54 = auVar93;
                        pfVar58 = pfVar58 + 4;
                        pauVar54 = pauVar54 + 1;
                        uVar47 = uVar47 - 1;
                      } while (uVar47 != 0);
                    }
                    uVar38 = uVar38 + 1;
                  } while (uVar38 != uVar48);
                }
                pMVar35 = (Mat *)((long)&pMVar35->data + 1);
              } while (pMVar35 != pMVar45);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_90 = pMVar45;
        if (((uVar4 == 1 && (uVar49 ^ uVar57) == 0) && uVar3 == uVar47) && uVar48 != 1) {
          local_88 = pMVar39;
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_90) {
              pMVar39 = (Mat *)0x0;
              do {
                if (0 < (int)uVar48) {
                  sVar6 = local_88[1].elemsize;
                  pvVar53 = (void *)(this_00->cstep * (long)pMVar39 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar59 = (void *)(local_88->cstep * (long)pMVar39 * local_88->elemsize +
                                    (long)local_88->data);
                  sVar5 = local_88[1].cstep;
                  pvVar8 = local_88[1].data;
                  uVar47 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      lVar43 = 0;
                      do {
                        pfVar58 = (float *)((long)pvVar59 + lVar43);
                        pfVar51 = (float *)((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar39);
                        auVar99._0_4_ = *pfVar51 * *pfVar58;
                        auVar99._4_4_ = pfVar51[1] * pfVar58[1];
                        auVar99._8_4_ = pfVar51[2] * pfVar58[2];
                        auVar99._12_4_ = pfVar51[3] * pfVar58[3];
                        *(undefined1 (*) [16])((long)pvVar53 + lVar43) = auVar99;
                        lVar43 = lVar43 + 0x10;
                      } while ((ulong)uVar57 << 4 != lVar43);
                      pvVar53 = (void *)((long)pvVar53 + lVar43);
                      pvVar59 = (void *)((long)pvVar59 + lVar43);
                    }
                    uVar47 = uVar47 + 1;
                  } while (uVar47 != uVar48);
                }
                pMVar39 = (Mat *)((long)&pMVar39->data + 1);
              } while (pMVar39 != local_90);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar57 ^ 1) == 0 && uVar48 == uVar4) && uVar3 == uVar47) && uVar49 != 1) {
          local_88 = pMVar39;
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_90) {
              pMVar39 = (Mat *)0x0;
              do {
                if (0 < (int)uVar4) {
                  sVar6 = local_88->cstep;
                  sVar5 = local_88->elemsize;
                  pvVar8 = local_88->data;
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * (long)pMVar39 * this_00->elemsize +
                             (long)this_00->data);
                  pfVar58 = (float *)(local_88[1].cstep * (long)pMVar39 * local_88[1].elemsize +
                                     (long)local_88[1].data);
                  uVar38 = 0;
                  do {
                    if (0 < (int)uVar49) {
                      pfVar51 = (float *)((long)pvVar8 +
                                         uVar38 * 0x10 + sVar6 * (long)pMVar39 * sVar5);
                      fVar60 = *pfVar51;
                      fVar1 = pfVar51[1];
                      fVar32 = pfVar51[2];
                      fVar33 = pfVar51[3];
                      uVar57 = uVar49;
                      do {
                        auVar101._0_4_ = *pfVar58 * fVar60;
                        auVar101._4_4_ = pfVar58[1] * fVar1;
                        auVar101._8_4_ = pfVar58[2] * fVar32;
                        auVar101._12_4_ = pfVar58[3] * fVar33;
                        *pauVar54 = auVar101;
                        pfVar58 = pfVar58 + 4;
                        pauVar54 = pauVar54 + 1;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    uVar38 = uVar38 + 1;
                  } while (uVar38 != uVar4);
                }
                pMVar39 = (Mat *)((long)&pMVar39->data + 1);
              } while (pMVar39 != local_90);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_88 = pMVar39;
        if ((((uVar49 ^ uVar57) == 0 && uVar48 == 1) && uVar47 == uVar3) && uVar4 != 1) {
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_90) {
              pMVar39 = (Mat *)0x0;
              do {
                if (0 < (int)uVar4) {
                  sVar6 = local_88->elemsize;
                  pvVar53 = (void *)(this_00->cstep * (long)pMVar39 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar59 = (void *)(local_88[1].cstep * (long)pMVar39 * local_88[1].elemsize +
                                    (long)local_88[1].data);
                  sVar5 = local_88->cstep;
                  pvVar8 = local_88->data;
                  uVar57 = 0;
                  do {
                    if (0 < (int)uVar49) {
                      lVar43 = 0;
                      do {
                        pfVar58 = (float *)((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar39);
                        pfVar51 = (float *)((long)pvVar59 + lVar43);
                        auVar105._0_4_ = *pfVar51 * *pfVar58;
                        auVar105._4_4_ = pfVar51[1] * pfVar58[1];
                        auVar105._8_4_ = pfVar51[2] * pfVar58[2];
                        auVar105._12_4_ = pfVar51[3] * pfVar58[3];
                        *(undefined1 (*) [16])((long)pvVar53 + lVar43) = auVar105;
                        lVar43 = lVar43 + 0x10;
                      } while ((ulong)uVar49 << 4 != lVar43);
                      pvVar53 = (void *)((long)pvVar53 + lVar43);
                      pvVar59 = (void *)((long)pvVar59 + lVar43);
                    }
                    uVar57 = uVar57 + 1;
                  } while (uVar57 != uVar4);
                }
                pMVar39 = (Mat *)((long)&pMVar39->data + 1);
              } while (pMVar39 != local_90);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003cc95f;
      }
      if (pMVar39[1].dims == 4) {
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar42) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pfVar58 = (float *)(pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                                   (long)pMVar39[1].data);
                pfVar51 = (float *)(pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize +
                                   (long)pMVar39->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar4) {
                    uVar57 = 0;
                    do {
                      if (0 < (int)uVar49) {
                        fVar60 = *pfVar51;
                        fVar1 = pfVar51[1];
                        fVar32 = pfVar51[2];
                        fVar33 = pfVar51[3];
                        uVar48 = uVar49;
                        do {
                          auVar63._0_4_ = *pfVar58 * fVar60;
                          auVar63._4_4_ = pfVar58[1] * fVar1;
                          auVar63._8_4_ = pfVar58[2] * fVar32;
                          auVar63._12_4_ = pfVar58[3] * fVar33;
                          *pauVar54 = auVar63;
                          pfVar58 = pfVar58 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar48 = uVar48 - 1;
                        } while (uVar48 != 0);
                      }
                      pfVar51 = pfVar51 + 4;
                      uVar57 = uVar57 + 1;
                    } while (uVar57 != uVar4);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar42);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar39[1].dims != 1) {
        if (pMVar39[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < (int)uVar48) {
              pauVar54 = (undefined1 (*) [16])
                         (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
              pfVar51 = (float *)((long)pMVar39[1].w * uVar36 * pMVar39[1].elemsize +
                                 (long)pMVar39[1].data);
              pfVar58 = (float *)(pMVar39->cstep * uVar36 * pMVar39->elemsize + (long)pMVar39->data)
              ;
              uVar47 = 0;
              do {
                if (0 < (int)uVar57) {
                  fVar60 = *pfVar51;
                  fVar1 = pfVar51[1];
                  fVar32 = pfVar51[2];
                  fVar33 = pfVar51[3];
                  uVar49 = uVar57;
                  do {
                    auVar74._0_4_ = *pfVar58 * fVar60;
                    auVar74._4_4_ = pfVar58[1] * fVar1;
                    auVar74._8_4_ = pfVar58[2] * fVar32;
                    auVar74._12_4_ = pfVar58[3] * fVar33;
                    *pauVar54 = auVar74;
                    pfVar58 = pfVar58 + 4;
                    pauVar54 = pauVar54 + 1;
                    uVar49 = uVar49 - 1;
                  } while (uVar49 != 0);
                }
                pfVar51 = pfVar51 + 4;
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar48);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
      if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < (int)local_a0) {
              sVar6 = this_00->cstep;
              sVar5 = this_00->elemsize;
              pfVar58 = (float *)((long)pMVar35->data + uVar36 * 0x10);
              fVar60 = *pfVar58;
              fVar1 = pfVar58[1];
              fVar32 = pfVar58[2];
              fVar33 = pfVar58[3];
              pvVar8 = this_00->data;
              sVar9 = pMVar39->cstep;
              sVar10 = pMVar39->elemsize;
              pvVar53 = pMVar39->data;
              lVar43 = 0;
              iVar34 = (int)local_a0;
              do {
                pfVar58 = (float *)((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36);
                auVar95._0_4_ = *pfVar58 * fVar60;
                auVar95._4_4_ = pfVar58[1] * fVar1;
                auVar95._8_4_ = pfVar58[2] * fVar32;
                auVar95._12_4_ = pfVar58[3] * fVar33;
                *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36) = auVar95;
                lVar43 = lVar43 + 0x10;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
      break;
    case 4:
      if (pMVar39[1].dims == 4) goto LAB_003cc95f;
      local_90 = pMVar35;
      Mat::create(this_00,uVar57,uVar48,iVar41,uVar47,sVar6,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = pMVar39[1].dims;
      if (iVar34 != 1) {
        if (iVar34 == 3) {
          if (0 < (int)uVar47) {
            uVar36 = 0;
            do {
              if (0 < iVar41) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                pfVar51 = (float *)(pMVar39[1].cstep * uVar36 * pMVar39[1].elemsize +
                                   (long)pMVar39[1].data);
                pfVar58 = (float *)(pMVar39->cstep * uVar36 * pMVar39->elemsize +
                                   (long)pMVar39->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar48) {
                    uVar47 = 0;
                    do {
                      if (0 < (int)uVar57) {
                        fVar60 = *pfVar51;
                        fVar1 = pfVar51[1];
                        fVar32 = pfVar51[2];
                        fVar33 = pfVar51[3];
                        uVar49 = uVar57;
                        do {
                          auVar91._0_4_ = *pfVar58 * fVar60;
                          auVar91._4_4_ = pfVar58[1] * fVar1;
                          auVar91._8_4_ = pfVar58[2] * fVar32;
                          auVar91._12_4_ = pfVar58[3] * fVar33;
                          *pauVar54 = auVar91;
                          pfVar58 = pfVar58 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar49 = uVar49 - 1;
                        } while (uVar49 != 0);
                      }
                      pfVar51 = pfVar51 + 4;
                      uVar47 = uVar47 + 1;
                    } while (uVar47 != uVar48);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar41);
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 != uVar38);
            return 0;
          }
          return 0;
        }
        if (iVar34 != 2) {
          return 0;
        }
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < iVar41) {
              pauVar54 = (undefined1 (*) [16])
                         (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
              pfVar51 = (float *)((long)pMVar39[1].w * uVar36 * pMVar39[1].elemsize +
                                 (long)pMVar39[1].data);
              pfVar58 = (float *)(pMVar39->cstep * uVar36 * pMVar39->elemsize + (long)pMVar39->data)
              ;
              iVar34 = 0;
              do {
                if (0 < (int)uVar48) {
                  fVar60 = *pfVar51;
                  fVar1 = pfVar51[1];
                  fVar32 = pfVar51[2];
                  fVar33 = pfVar51[3];
                  uVar47 = 0;
                  do {
                    uVar49 = uVar57;
                    if (0 < (int)uVar57) {
                      do {
                        auVar67._0_4_ = *pfVar58 * fVar60;
                        auVar67._4_4_ = pfVar58[1] * fVar1;
                        auVar67._8_4_ = pfVar58[2] * fVar32;
                        auVar67._12_4_ = pfVar58[3] * fVar33;
                        *pauVar54 = auVar67;
                        pfVar58 = pfVar58 + 4;
                        pauVar54 = pauVar54 + 1;
                        uVar49 = uVar49 - 1;
                      } while (uVar49 != 0);
                    }
                    uVar47 = uVar47 + 1;
                  } while (uVar47 != uVar48);
                }
                pfVar51 = pfVar51 + 4;
                iVar34 = iVar34 + 1;
              } while (iVar34 != iVar41);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
      pMVar35 = local_90;
      if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < (int)local_a0) {
              sVar6 = pMVar39->cstep;
              sVar5 = pMVar39->elemsize;
              pfVar58 = (float *)((long)local_90->data + uVar36 * 0x10);
              fVar60 = *pfVar58;
              fVar1 = pfVar58[1];
              fVar32 = pfVar58[2];
              fVar33 = pfVar58[3];
              pvVar8 = pMVar39->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar53 = this_00->data;
              lVar43 = 0;
              iVar34 = (int)local_a0;
              do {
                pfVar58 = (float *)((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36);
                auVar97._0_4_ = *pfVar58 * fVar60;
                auVar97._4_4_ = pfVar58[1] * fVar1;
                auVar97._8_4_ = pfVar58[2] * fVar32;
                auVar97._12_4_ = pfVar58[3] * fVar33;
                *(undefined1 (*) [16])((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36) = auVar97;
                lVar43 = lVar43 + 0x10;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
    }
    iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_mul>
                       (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
    return iVar34;
  case 3:
    pMVar45 = pMVar35;
    goto LAB_003cc5f7;
  case 4:
    if (3 < pMVar39->dims - 1U) {
      return 0;
    }
    local_c8 = (float *)CONCAT44(local_c8._4_4_,iVar34);
    local_b8._0_8_ = opt;
    local_c0 = (float *)CONCAT44(local_c0._4_4_,iVar56);
    uVar57 = pMVar39->w;
    uVar48 = pMVar39->h;
    iVar41 = pMVar39->d;
    uVar47 = pMVar39->c;
    uVar38 = (ulong)uVar47;
    local_a0 = (float *)CONCAT44(local_a0._4_4_,uVar48 * uVar57 * iVar41);
    sVar6 = pMVar39->elemsize;
    uVar49 = pMVar39[1].w;
    uVar4 = pMVar39[1].h;
    iVar42 = pMVar39[1].d;
    uVar3 = pMVar39[1].c;
    pMVar45 = (Mat *)(ulong)uVar3;
    iVar40 = uVar4 * uVar49 * iVar42;
    sVar5 = pMVar39[1].elemsize;
    local_98 = sVar6;
    switch(pMVar39->dims) {
    case 1:
      if (iVar34 == 1 && uVar57 == 1) {
        Mat::create_like(this_00,pMVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            uVar57 = iVar40 * (int)local_c0;
            pMVar35 = (Mat *)0x0;
            do {
              pauVar54 = (undefined1 (*) [16])
                         (pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                         (long)pMVar39[1].data);
              pauVar46 = (undefined1 (*) [16])
                         (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data);
              fVar60 = *pMVar39->data;
              if ((int)uVar57 < 4) {
                uVar48 = 0;
              }
              else {
                auVar61._4_4_ = fVar60;
                auVar61._0_4_ = fVar60;
                auVar61._8_4_ = fVar60;
                auVar61._12_4_ = fVar60;
                iVar34 = 3;
                do {
                  auVar80 = maxps(*pauVar54,auVar61);
                  *pauVar46 = auVar80;
                  pauVar54 = pauVar54 + 1;
                  pauVar46 = pauVar46 + 1;
                  iVar34 = iVar34 + 4;
                  uVar48 = uVar57 & 0xfffffffc;
                } while (iVar34 < (int)uVar57);
              }
              if (uVar57 - uVar48 != 0 && (int)uVar48 <= (int)uVar57) {
                lVar43 = 0;
                do {
                  fVar1 = *(float *)(*pauVar54 + lVar43 * 4);
                  if (*(float *)(*pauVar54 + lVar43 * 4) <= fVar60) {
                    fVar1 = fVar60;
                  }
                  *(float *)((long)*pauVar46 + lVar43 * 4) = fVar1;
                  lVar43 = lVar43 + 1;
                } while (uVar57 - uVar48 != (int)lVar43);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      switch(pMVar39[1].dims) {
      case 1:
        Mat::create(this_00,uVar57,sVar6,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_max>
                    (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
          return 0;
        }
        break;
      case 2:
        Mat::create(this_00,uVar49,uVar4,sVar5,iVar56,opt->blob_allocator);
        pauVar54 = (undefined1 (*) [16])this_00->data;
        if (pauVar54 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar4) {
            pauVar46 = (undefined1 (*) [16])pMVar39->data;
            pauVar50 = (undefined1 (*) [16])pMVar39[1].data;
            uVar57 = 0;
            do {
              if (0 < (int)uVar49) {
                auVar80 = *pauVar46;
                uVar48 = uVar49;
                do {
                  auVar69 = maxps(*pauVar50,auVar80);
                  *pauVar54 = auVar69;
                  pauVar50 = pauVar50 + 1;
                  pauVar54 = pauVar54 + 1;
                  uVar48 = uVar48 - 1;
                } while (uVar48 != 0);
              }
              pauVar46 = pauVar46 + 1;
              uVar57 = uVar57 + 1;
            } while (uVar57 != uVar4);
            return 0;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar6 = this_00->cstep;
                sVar5 = this_00->elemsize;
                auVar80 = *(undefined1 (*) [16])((long)pMVar39->data + (long)pMVar35 * 0x10);
                pvVar8 = this_00->data;
                sVar9 = pMVar39[1].cstep;
                sVar10 = pMVar39[1].elemsize;
                pvVar53 = pMVar39[1].data;
                lVar43 = 0;
                iVar34 = iVar40;
                do {
                  auVar69 = maxps(*(undefined1 (*) [16])
                                   ((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35),auVar80
                                 );
                  *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35) =
                       auVar69;
                  lVar43 = lVar43 + 0x10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar6 = this_00->cstep;
                sVar5 = this_00->elemsize;
                auVar80 = *(undefined1 (*) [16])((long)pMVar39->data + (long)pMVar35 * 0x10);
                pvVar8 = this_00->data;
                sVar9 = pMVar39[1].cstep;
                sVar10 = pMVar39[1].elemsize;
                pvVar53 = pMVar39[1].data;
                lVar43 = 0;
                iVar34 = iVar40;
                do {
                  auVar69 = maxps(*(undefined1 (*) [16])
                                   ((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35),auVar80
                                 );
                  *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35) =
                       auVar69;
                  lVar43 = lVar43 + 0x10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      default:
        goto LAB_003d2cdb;
      }
      break;
    case 2:
      pAVar7 = opt->blob_allocator;
      if (pMVar39[1].dims == 3) {
        Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pauVar46 = (undefined1 (*) [16])
                           (pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                           (long)pMVar39[1].data);
                pauVar50 = (undefined1 (*) [16])
                           ((long)pMVar39->w * (long)pMVar35 * pMVar39->elemsize +
                           (long)pMVar39->data);
                uVar57 = 0;
                do {
                  if (0 < (int)uVar49) {
                    auVar80 = *pauVar50;
                    uVar48 = uVar49;
                    do {
                      auVar69 = maxps(*pauVar46,auVar80);
                      *pauVar54 = auVar69;
                      pauVar46 = pauVar46 + 1;
                      pauVar54 = pauVar54 + 1;
                      uVar48 = uVar48 - 1;
                    } while (uVar48 != 0);
                  }
                  pauVar50 = pauVar50 + 1;
                  uVar57 = uVar57 + 1;
                } while (uVar57 != uVar4);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pMVar39[1].dims == 4) {
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar42) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pauVar46 = (undefined1 (*) [16])
                           (pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                           (long)pMVar39[1].data);
                pauVar50 = (undefined1 (*) [16])
                           ((long)pMVar39->w * (long)pMVar35 * pMVar39->elemsize +
                           (long)pMVar39->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar4) {
                    auVar80 = *pauVar50;
                    uVar57 = 0;
                    do {
                      uVar48 = uVar49;
                      if (0 < (int)uVar49) {
                        do {
                          auVar69 = maxps(*pauVar46,auVar80);
                          *pauVar54 = auVar69;
                          pauVar46 = pauVar46 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar48 = uVar48 - 1;
                        } while (uVar48 != 0);
                      }
                      uVar57 = uVar57 + 1;
                    } while (uVar57 != uVar4);
                  }
                  pauVar50 = pauVar50 + 1;
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar42);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar57,uVar48,sVar6,iVar34,pAVar7);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar39[1].dims != 1) {
        if (pMVar39[1].dims != 2) {
          return 0;
        }
LAB_003cc72a:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_max>
                           (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
        return iVar34;
      }
      Mat::create(this_00,uVar57,uVar48,sVar6,(int)local_c8,*(Allocator **)(local_b8._0_8_ + 8));
      pauVar54 = (undefined1 (*) [16])this_00->data;
      if (pauVar54 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
        if (0 < (int)uVar48) {
          pauVar46 = (undefined1 (*) [16])pMVar39->data;
          pauVar50 = (undefined1 (*) [16])pMVar39[1].data;
          uVar47 = 0;
          do {
            if (0 < (int)uVar57) {
              auVar80 = *pauVar50;
              uVar49 = uVar57;
              do {
                auVar69 = maxps(*pauVar46,auVar80);
                *pauVar54 = auVar69;
                pauVar46 = pauVar46 + 1;
                pauVar54 = pauVar54 + 1;
                uVar49 = uVar49 - 1;
              } while (uVar49 != 0);
            }
            pauVar50 = pauVar50 + 1;
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar48);
          return 0;
        }
        return 0;
      }
      break;
    case 3:
      if (pMVar39[1].dims == 3) {
        if (uVar3 == uVar47 && (uVar4 == 1 && (uVar49 ^ 1) == 0)) {
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar47) {
              uVar36 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  auVar80 = *(undefined1 (*) [16])
                             ((long)pMVar39[1].data +
                             pMVar39[1].cstep * uVar36 * pMVar39[1].elemsize);
                  pvVar8 = this_00->data;
                  sVar9 = pMVar39->cstep;
                  sVar10 = pMVar39->elemsize;
                  pvVar53 = pMVar39->data;
                  lVar43 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    auVar69 = maxps(*(undefined1 (*) [16])
                                     ((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36),auVar80);
                    *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36) = auVar69
                    ;
                    lVar43 = lVar43 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar38);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar49 == uVar57) && (iVar56 == 1 && (uVar3 == 1 && uVar4 == uVar48))) {
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar47) {
              uVar36 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  sVar9 = pMVar39->cstep;
                  pvVar8 = this_00->data;
                  pvVar53 = pMVar39[1].data;
                  sVar10 = pMVar39->elemsize;
                  pvVar59 = pMVar39->data;
                  lVar43 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    uVar2 = *(undefined4 *)((long)pvVar53 + lVar43);
                    auVar76._4_4_ = uVar2;
                    auVar76._0_4_ = uVar2;
                    auVar76._8_4_ = uVar2;
                    auVar76._12_4_ = uVar2;
                    auVar80 = maxps(auVar76,*(undefined1 (*) [16])
                                             ((long)pvVar59 + lVar43 * 4 + sVar9 * sVar10 * uVar36))
                    ;
                    *(undefined1 (*) [16])((long)pvVar8 + lVar43 * 4 + sVar6 * sVar5 * uVar36) =
                         auVar80;
                    lVar43 = lVar43 + 4;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar38);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_a0 = (float *)sVar5;
        if ((uVar48 == 1 && (uVar57 ^ 1) == 0) && uVar47 == uVar3) {
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pMVar35 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar6 = pMVar39[1].cstep;
                  sVar5 = pMVar39[1].elemsize;
                  auVar80 = *(undefined1 (*) [16])
                             ((long)pMVar39->data +
                             pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize);
                  pvVar8 = pMVar39[1].data;
                  sVar9 = this_00->cstep;
                  sVar10 = this_00->elemsize;
                  pvVar53 = this_00->data;
                  lVar43 = 0;
                  iVar34 = iVar40;
                  do {
                    auVar69 = maxps(*(undefined1 (*) [16])
                                     ((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35),auVar80
                                   );
                    *(undefined1 (*) [16])((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35)
                         = auVar69;
                    lVar43 = lVar43 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                pMVar35 = (Mat *)((long)&pMVar35->data + 1);
              } while (pMVar35 != pMVar45);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar49 == uVar57) && (iVar34 == 1)) && (uVar4 == uVar48)) && (uVar47 == 1)) {
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pMVar35 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  pvVar8 = pMVar39->data;
                  pvVar53 = this_00->data;
                  sVar9 = pMVar39[1].cstep;
                  sVar10 = pMVar39[1].elemsize;
                  pvVar59 = pMVar39[1].data;
                  lVar43 = 0;
                  iVar34 = iVar40;
                  do {
                    uVar2 = *(undefined4 *)((long)pvVar8 + lVar43);
                    auVar28._4_4_ = uVar2;
                    auVar28._0_4_ = uVar2;
                    auVar28._8_4_ = uVar2;
                    auVar28._12_4_ = uVar2;
                    auVar80 = maxps(*(undefined1 (*) [16])
                                     ((long)pvVar59 + lVar43 * 4 + sVar9 * sVar10 * (long)pMVar35),
                                    auVar28);
                    *(undefined1 (*) [16])
                     ((long)pvVar53 + lVar43 * 4 + sVar6 * sVar5 * (long)pMVar35) = auVar80;
                    lVar43 = lVar43 + 4;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                pMVar35 = (Mat *)((long)&pMVar35->data + 1);
              } while (pMVar35 != pMVar45);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar49 ^ 1) == 0 && uVar4 == uVar48) && uVar47 == uVar3) && uVar57 != 1) {
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pMVar35 = (Mat *)0x0;
              do {
                if (0 < (int)uVar48) {
                  sVar6 = pMVar39[1].cstep;
                  sVar5 = pMVar39[1].elemsize;
                  pvVar8 = pMVar39[1].data;
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * (long)pMVar35 * this_00->elemsize +
                             (long)this_00->data);
                  pauVar46 = (undefined1 (*) [16])
                             (pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize +
                             (long)pMVar39->data);
                  uVar38 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar80 = *(undefined1 (*) [16])
                                 ((long)pvVar8 + uVar38 * 0x10 + sVar6 * (long)pMVar35 * sVar5);
                      uVar47 = uVar57;
                      do {
                        auVar69 = maxps(*pauVar46,auVar80);
                        *pauVar54 = auVar69;
                        pauVar46 = pauVar46 + 1;
                        pauVar54 = pauVar54 + 1;
                        uVar47 = uVar47 - 1;
                      } while (uVar47 != 0);
                    }
                    uVar38 = uVar38 + 1;
                  } while (uVar38 != uVar48);
                }
                pMVar35 = (Mat *)((long)&pMVar35->data + 1);
              } while (pMVar35 != pMVar45);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_90 = pMVar45;
        if (((uVar4 == 1 && (uVar49 ^ uVar57) == 0) && uVar3 == uVar47) && uVar48 != 1) {
          local_88 = pMVar39;
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_90) {
              pMVar39 = (Mat *)0x0;
              do {
                if (0 < (int)uVar48) {
                  sVar6 = local_88[1].elemsize;
                  pvVar53 = (void *)(this_00->cstep * (long)pMVar39 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar59 = (void *)(local_88->cstep * (long)pMVar39 * local_88->elemsize +
                                    (long)local_88->data);
                  sVar5 = local_88[1].cstep;
                  pvVar8 = local_88[1].data;
                  uVar47 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      lVar43 = 0;
                      do {
                        auVar80 = maxps(*(undefined1 (*) [16])
                                         ((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar39),
                                        *(undefined1 (*) [16])((long)pvVar59 + lVar43));
                        *(undefined1 (*) [16])((long)pvVar53 + lVar43) = auVar80;
                        lVar43 = lVar43 + 0x10;
                      } while ((ulong)uVar57 << 4 != lVar43);
                      pvVar53 = (void *)((long)pvVar53 + lVar43);
                      pvVar59 = (void *)((long)pvVar59 + lVar43);
                    }
                    uVar47 = uVar47 + 1;
                  } while (uVar47 != uVar48);
                }
                pMVar39 = (Mat *)((long)&pMVar39->data + 1);
              } while (pMVar39 != local_90);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar57 ^ 1) == 0 && uVar48 == uVar4) && uVar3 == uVar47) && uVar49 != 1) {
          local_88 = pMVar39;
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_90) {
              pMVar39 = (Mat *)0x0;
              do {
                if (0 < (int)uVar4) {
                  sVar6 = local_88->cstep;
                  sVar5 = local_88->elemsize;
                  pvVar8 = local_88->data;
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * (long)pMVar39 * this_00->elemsize +
                             (long)this_00->data);
                  pauVar46 = (undefined1 (*) [16])
                             (local_88[1].cstep * (long)pMVar39 * local_88[1].elemsize +
                             (long)local_88[1].data);
                  uVar38 = 0;
                  do {
                    if (0 < (int)uVar49) {
                      auVar80 = *(undefined1 (*) [16])
                                 ((long)pvVar8 + uVar38 * 0x10 + sVar6 * (long)pMVar39 * sVar5);
                      uVar57 = uVar49;
                      do {
                        auVar69 = maxps(*pauVar46,auVar80);
                        *pauVar54 = auVar69;
                        pauVar46 = pauVar46 + 1;
                        pauVar54 = pauVar54 + 1;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    uVar38 = uVar38 + 1;
                  } while (uVar38 != uVar4);
                }
                pMVar39 = (Mat *)((long)&pMVar39->data + 1);
              } while (pMVar39 != local_90);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_88 = pMVar39;
        if ((((uVar49 ^ uVar57) == 0 && uVar48 == 1) && uVar47 == uVar3) && uVar4 != 1) {
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_90) {
              pMVar39 = (Mat *)0x0;
              do {
                if (0 < (int)uVar4) {
                  sVar6 = local_88->elemsize;
                  pvVar53 = (void *)(this_00->cstep * (long)pMVar39 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar59 = (void *)(local_88[1].cstep * (long)pMVar39 * local_88[1].elemsize +
                                    (long)local_88[1].data);
                  sVar5 = local_88->cstep;
                  pvVar8 = local_88->data;
                  uVar57 = 0;
                  do {
                    if (0 < (int)uVar49) {
                      lVar43 = 0;
                      do {
                        auVar80 = maxps(*(undefined1 (*) [16])((long)pvVar59 + lVar43),
                                        *(undefined1 (*) [16])
                                         ((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar39));
                        *(undefined1 (*) [16])((long)pvVar53 + lVar43) = auVar80;
                        lVar43 = lVar43 + 0x10;
                      } while ((ulong)uVar49 << 4 != lVar43);
                      pvVar53 = (void *)((long)pvVar53 + lVar43);
                      pvVar59 = (void *)((long)pvVar59 + lVar43);
                    }
                    uVar57 = uVar57 + 1;
                  } while (uVar57 != uVar4);
                }
                pMVar39 = (Mat *)((long)&pMVar39->data + 1);
              } while (pMVar39 != local_90);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003cc72a;
      }
      if (pMVar39[1].dims == 4) {
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar42) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pauVar46 = (undefined1 (*) [16])
                           (pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                           (long)pMVar39[1].data);
                pauVar50 = (undefined1 (*) [16])
                           (pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize + (long)pMVar39->data
                           );
                iVar34 = 0;
                do {
                  if (0 < (int)uVar4) {
                    uVar57 = 0;
                    do {
                      if (0 < (int)uVar49) {
                        auVar80 = *pauVar50;
                        uVar48 = uVar49;
                        do {
                          auVar69 = maxps(*pauVar46,auVar80);
                          *pauVar54 = auVar69;
                          pauVar46 = pauVar46 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar48 = uVar48 - 1;
                        } while (uVar48 != 0);
                      }
                      pauVar50 = pauVar50 + 1;
                      uVar57 = uVar57 + 1;
                    } while (uVar57 != uVar4);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar42);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar39[1].dims != 1) {
        if (pMVar39[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < (int)uVar48) {
              pauVar54 = (undefined1 (*) [16])
                         (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
              pauVar50 = (undefined1 (*) [16])
                         ((long)pMVar39[1].w * uVar36 * pMVar39[1].elemsize + (long)pMVar39[1].data)
              ;
              pauVar46 = (undefined1 (*) [16])
                         (pMVar39->cstep * uVar36 * pMVar39->elemsize + (long)pMVar39->data);
              uVar47 = 0;
              do {
                if (0 < (int)uVar57) {
                  auVar80 = *pauVar50;
                  uVar49 = uVar57;
                  do {
                    auVar69 = maxps(*pauVar46,auVar80);
                    *pauVar54 = auVar69;
                    pauVar46 = pauVar46 + 1;
                    pauVar54 = pauVar54 + 1;
                    uVar49 = uVar49 - 1;
                  } while (uVar49 != 0);
                }
                pauVar50 = pauVar50 + 1;
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar48);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
      if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < (int)local_a0) {
              sVar6 = this_00->cstep;
              sVar5 = this_00->elemsize;
              auVar80 = *(undefined1 (*) [16])((long)pMVar35->data + uVar36 * 0x10);
              pvVar8 = this_00->data;
              sVar9 = pMVar39->cstep;
              sVar10 = pMVar39->elemsize;
              pvVar53 = pMVar39->data;
              lVar43 = 0;
              iVar34 = (int)local_a0;
              do {
                auVar69 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36),auVar80);
                *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36) = auVar69;
                lVar43 = lVar43 + 0x10;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
      break;
    case 4:
      if (pMVar39[1].dims == 4) goto LAB_003cc72a;
      local_90 = pMVar35;
      Mat::create(this_00,uVar57,uVar48,iVar41,uVar47,sVar6,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = pMVar39[1].dims;
      if (iVar34 != 1) {
        if (iVar34 == 3) {
          if (0 < (int)uVar47) {
            uVar36 = 0;
            do {
              if (0 < iVar41) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                pauVar50 = (undefined1 (*) [16])
                           (pMVar39[1].cstep * uVar36 * pMVar39[1].elemsize + (long)pMVar39[1].data)
                ;
                pauVar46 = (undefined1 (*) [16])
                           (pMVar39->cstep * uVar36 * pMVar39->elemsize + (long)pMVar39->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar48) {
                    uVar47 = 0;
                    do {
                      if (0 < (int)uVar57) {
                        auVar80 = *pauVar50;
                        uVar49 = uVar57;
                        do {
                          auVar69 = maxps(*pauVar46,auVar80);
                          *pauVar54 = auVar69;
                          pauVar46 = pauVar46 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar49 = uVar49 - 1;
                        } while (uVar49 != 0);
                      }
                      pauVar50 = pauVar50 + 1;
                      uVar47 = uVar47 + 1;
                    } while (uVar47 != uVar48);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar41);
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 != uVar38);
            return 0;
          }
          return 0;
        }
        if (iVar34 != 2) {
          return 0;
        }
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < iVar41) {
              pauVar54 = (undefined1 (*) [16])
                         (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
              pauVar50 = (undefined1 (*) [16])
                         ((long)pMVar39[1].w * uVar36 * pMVar39[1].elemsize + (long)pMVar39[1].data)
              ;
              pauVar46 = (undefined1 (*) [16])
                         (pMVar39->cstep * uVar36 * pMVar39->elemsize + (long)pMVar39->data);
              iVar34 = 0;
              do {
                if (0 < (int)uVar48) {
                  auVar80 = *pauVar50;
                  uVar47 = 0;
                  do {
                    uVar49 = uVar57;
                    if (0 < (int)uVar57) {
                      do {
                        auVar69 = maxps(*pauVar46,auVar80);
                        *pauVar54 = auVar69;
                        pauVar46 = pauVar46 + 1;
                        pauVar54 = pauVar54 + 1;
                        uVar49 = uVar49 - 1;
                      } while (uVar49 != 0);
                    }
                    uVar47 = uVar47 + 1;
                  } while (uVar47 != uVar48);
                }
                pauVar50 = pauVar50 + 1;
                iVar34 = iVar34 + 1;
              } while (iVar34 != iVar41);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
      pMVar35 = local_90;
      if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < (int)local_a0) {
              sVar6 = pMVar39->cstep;
              sVar5 = pMVar39->elemsize;
              auVar80 = *(undefined1 (*) [16])((long)local_90->data + uVar36 * 0x10);
              pvVar8 = pMVar39->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar53 = this_00->data;
              lVar43 = 0;
              iVar34 = (int)local_a0;
              do {
                auVar69 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36),auVar80);
                *(undefined1 (*) [16])((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36) = auVar69;
                lVar43 = lVar43 + 0x10;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
    }
    iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_max>
                       (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
    return iVar34;
  case 5:
    if (3 < pMVar39->dims - 1U) {
      return 0;
    }
    local_c8 = (float *)CONCAT44(local_c8._4_4_,iVar34);
    local_b8._0_8_ = opt;
    local_c0 = (float *)CONCAT44(local_c0._4_4_,iVar56);
    uVar57 = pMVar39->w;
    uVar48 = pMVar39->h;
    iVar41 = pMVar39->d;
    uVar47 = pMVar39->c;
    uVar38 = (ulong)uVar47;
    local_a0 = (float *)CONCAT44(local_a0._4_4_,uVar48 * uVar57 * iVar41);
    sVar6 = pMVar39->elemsize;
    uVar49 = pMVar39[1].w;
    uVar4 = pMVar39[1].h;
    iVar42 = pMVar39[1].d;
    uVar3 = pMVar39[1].c;
    pMVar45 = (Mat *)(ulong)uVar3;
    iVar40 = uVar4 * uVar49 * iVar42;
    sVar5 = pMVar39[1].elemsize;
    local_98 = sVar6;
    switch(pMVar39->dims) {
    case 1:
      if (iVar34 == 1 && uVar57 == 1) {
        Mat::create_like(this_00,pMVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            uVar57 = iVar40 * (int)local_c0;
            pMVar35 = (Mat *)0x0;
            do {
              pauVar54 = (undefined1 (*) [16])
                         (pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                         (long)pMVar39[1].data);
              pauVar46 = (undefined1 (*) [16])
                         (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data);
              fVar60 = *pMVar39->data;
              if ((int)uVar57 < 4) {
                uVar48 = 0;
              }
              else {
                auVar62._4_4_ = fVar60;
                auVar62._0_4_ = fVar60;
                auVar62._8_4_ = fVar60;
                auVar62._12_4_ = fVar60;
                iVar34 = 3;
                do {
                  auVar80 = minps(*pauVar54,auVar62);
                  *pauVar46 = auVar80;
                  pauVar54 = pauVar54 + 1;
                  pauVar46 = pauVar46 + 1;
                  iVar34 = iVar34 + 4;
                  uVar48 = uVar57 & 0xfffffffc;
                } while (iVar34 < (int)uVar57);
              }
              if (uVar57 - uVar48 != 0 && (int)uVar48 <= (int)uVar57) {
                lVar43 = 0;
                do {
                  fVar1 = *(float *)(*pauVar54 + lVar43 * 4);
                  if (fVar60 <= *(float *)(*pauVar54 + lVar43 * 4)) {
                    fVar1 = fVar60;
                  }
                  *(float *)((long)*pauVar46 + lVar43 * 4) = fVar1;
                  lVar43 = lVar43 + 1;
                } while (uVar57 - uVar48 != (int)lVar43);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      switch(pMVar39[1].dims) {
      case 1:
        Mat::create(this_00,uVar57,sVar6,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_min>
                    (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
          return 0;
        }
        break;
      case 2:
        Mat::create(this_00,uVar49,uVar4,sVar5,iVar56,opt->blob_allocator);
        pauVar54 = (undefined1 (*) [16])this_00->data;
        if (pauVar54 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar4) {
            pauVar46 = (undefined1 (*) [16])pMVar39->data;
            pauVar50 = (undefined1 (*) [16])pMVar39[1].data;
            uVar57 = 0;
            do {
              if (0 < (int)uVar49) {
                auVar80 = *pauVar46;
                uVar48 = uVar49;
                do {
                  auVar69 = minps(*pauVar50,auVar80);
                  *pauVar54 = auVar69;
                  pauVar50 = pauVar50 + 1;
                  pauVar54 = pauVar54 + 1;
                  uVar48 = uVar48 - 1;
                } while (uVar48 != 0);
              }
              pauVar46 = pauVar46 + 1;
              uVar57 = uVar57 + 1;
            } while (uVar57 != uVar4);
            return 0;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar6 = this_00->cstep;
                sVar5 = this_00->elemsize;
                auVar80 = *(undefined1 (*) [16])((long)pMVar39->data + (long)pMVar35 * 0x10);
                pvVar8 = this_00->data;
                sVar9 = pMVar39[1].cstep;
                sVar10 = pMVar39[1].elemsize;
                pvVar53 = pMVar39[1].data;
                lVar43 = 0;
                iVar34 = iVar40;
                do {
                  auVar69 = minps(*(undefined1 (*) [16])
                                   ((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35),auVar80
                                 );
                  *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35) =
                       auVar69;
                  lVar43 = lVar43 + 0x10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar6 = this_00->cstep;
                sVar5 = this_00->elemsize;
                auVar80 = *(undefined1 (*) [16])((long)pMVar39->data + (long)pMVar35 * 0x10);
                pvVar8 = this_00->data;
                sVar9 = pMVar39[1].cstep;
                sVar10 = pMVar39[1].elemsize;
                pvVar53 = pMVar39[1].data;
                lVar43 = 0;
                iVar34 = iVar40;
                do {
                  auVar69 = minps(*(undefined1 (*) [16])
                                   ((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35),auVar80
                                 );
                  *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35) =
                       auVar69;
                  lVar43 = lVar43 + 0x10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      default:
        goto LAB_003d2cdb;
      }
      break;
    case 2:
      pAVar7 = opt->blob_allocator;
      if (pMVar39[1].dims == 3) {
        Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pauVar46 = (undefined1 (*) [16])
                           (pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                           (long)pMVar39[1].data);
                pauVar50 = (undefined1 (*) [16])
                           ((long)pMVar39->w * (long)pMVar35 * pMVar39->elemsize +
                           (long)pMVar39->data);
                uVar57 = 0;
                do {
                  if (0 < (int)uVar49) {
                    auVar80 = *pauVar50;
                    uVar48 = uVar49;
                    do {
                      auVar69 = minps(*pauVar46,auVar80);
                      *pauVar54 = auVar69;
                      pauVar46 = pauVar46 + 1;
                      pauVar54 = pauVar54 + 1;
                      uVar48 = uVar48 - 1;
                    } while (uVar48 != 0);
                  }
                  pauVar50 = pauVar50 + 1;
                  uVar57 = uVar57 + 1;
                } while (uVar57 != uVar4);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pMVar39[1].dims == 4) {
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar42) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pauVar46 = (undefined1 (*) [16])
                           (pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                           (long)pMVar39[1].data);
                pauVar50 = (undefined1 (*) [16])
                           ((long)pMVar39->w * (long)pMVar35 * pMVar39->elemsize +
                           (long)pMVar39->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar4) {
                    auVar80 = *pauVar50;
                    uVar57 = 0;
                    do {
                      uVar48 = uVar49;
                      if (0 < (int)uVar49) {
                        do {
                          auVar69 = minps(*pauVar46,auVar80);
                          *pauVar54 = auVar69;
                          pauVar46 = pauVar46 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar48 = uVar48 - 1;
                        } while (uVar48 != 0);
                      }
                      uVar57 = uVar57 + 1;
                    } while (uVar57 != uVar4);
                  }
                  pauVar50 = pauVar50 + 1;
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar42);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar57,uVar48,sVar6,iVar34,pAVar7);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar39[1].dims != 1) {
        if (pMVar39[1].dims != 2) {
          return 0;
        }
LAB_003ccf59:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_min>
                           (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
        return iVar34;
      }
      Mat::create(this_00,uVar57,uVar48,sVar6,(int)local_c8,*(Allocator **)(local_b8._0_8_ + 8));
      pauVar54 = (undefined1 (*) [16])this_00->data;
      if (pauVar54 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
        if (0 < (int)uVar48) {
          pauVar46 = (undefined1 (*) [16])pMVar39->data;
          pauVar50 = (undefined1 (*) [16])pMVar39[1].data;
          uVar47 = 0;
          do {
            if (0 < (int)uVar57) {
              auVar80 = *pauVar50;
              uVar49 = uVar57;
              do {
                auVar69 = minps(*pauVar46,auVar80);
                *pauVar54 = auVar69;
                pauVar46 = pauVar46 + 1;
                pauVar54 = pauVar54 + 1;
                uVar49 = uVar49 - 1;
              } while (uVar49 != 0);
            }
            pauVar50 = pauVar50 + 1;
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar48);
          return 0;
        }
        return 0;
      }
      break;
    case 3:
      if (pMVar39[1].dims == 3) {
        if (uVar3 == uVar47 && (uVar4 == 1 && (uVar49 ^ 1) == 0)) {
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar47) {
              uVar36 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  auVar80 = *(undefined1 (*) [16])
                             ((long)pMVar39[1].data +
                             pMVar39[1].cstep * uVar36 * pMVar39[1].elemsize);
                  pvVar8 = this_00->data;
                  sVar9 = pMVar39->cstep;
                  sVar10 = pMVar39->elemsize;
                  pvVar53 = pMVar39->data;
                  lVar43 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    auVar69 = minps(*(undefined1 (*) [16])
                                     ((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36),auVar80);
                    *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36) = auVar69
                    ;
                    lVar43 = lVar43 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar38);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar49 == uVar57) && (iVar56 == 1 && (uVar3 == 1 && uVar4 == uVar48))) {
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar47) {
              uVar36 = 0;
              do {
                if (0 < (int)local_a0) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  sVar9 = pMVar39->cstep;
                  pvVar8 = this_00->data;
                  pvVar53 = pMVar39[1].data;
                  sVar10 = pMVar39->elemsize;
                  pvVar59 = pMVar39->data;
                  lVar43 = 0;
                  iVar34 = (int)local_a0;
                  do {
                    uVar2 = *(undefined4 *)((long)pvVar53 + lVar43);
                    auVar79._4_4_ = uVar2;
                    auVar79._0_4_ = uVar2;
                    auVar79._8_4_ = uVar2;
                    auVar79._12_4_ = uVar2;
                    auVar80 = minps(auVar79,*(undefined1 (*) [16])
                                             ((long)pvVar59 + lVar43 * 4 + sVar9 * sVar10 * uVar36))
                    ;
                    *(undefined1 (*) [16])((long)pvVar8 + lVar43 * 4 + sVar6 * sVar5 * uVar36) =
                         auVar80;
                    lVar43 = lVar43 + 4;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                uVar36 = uVar36 + 1;
              } while (uVar36 != uVar38);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_a0 = (float *)sVar5;
        if ((uVar48 == 1 && (uVar57 ^ 1) == 0) && uVar47 == uVar3) {
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pMVar35 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar6 = pMVar39[1].cstep;
                  sVar5 = pMVar39[1].elemsize;
                  auVar80 = *(undefined1 (*) [16])
                             ((long)pMVar39->data +
                             pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize);
                  pvVar8 = pMVar39[1].data;
                  sVar9 = this_00->cstep;
                  sVar10 = this_00->elemsize;
                  pvVar53 = this_00->data;
                  lVar43 = 0;
                  iVar34 = iVar40;
                  do {
                    auVar69 = minps(*(undefined1 (*) [16])
                                     ((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar35),auVar80
                                   );
                    *(undefined1 (*) [16])((long)pvVar53 + lVar43 + sVar9 * sVar10 * (long)pMVar35)
                         = auVar69;
                    lVar43 = lVar43 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                pMVar35 = (Mat *)((long)&pMVar35->data + 1);
              } while (pMVar35 != pMVar45);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar49 == uVar57) && (iVar34 == 1)) && ((uVar4 == uVar48 && (uVar47 == 1)))) {
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pMVar35 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar6 = this_00->cstep;
                  sVar5 = this_00->elemsize;
                  pvVar8 = pMVar39->data;
                  pvVar53 = this_00->data;
                  sVar9 = pMVar39[1].cstep;
                  sVar10 = pMVar39[1].elemsize;
                  pvVar59 = pMVar39[1].data;
                  lVar43 = 0;
                  iVar34 = iVar40;
                  do {
                    uVar2 = *(undefined4 *)((long)pvVar8 + lVar43);
                    auVar27._4_4_ = uVar2;
                    auVar27._0_4_ = uVar2;
                    auVar27._8_4_ = uVar2;
                    auVar27._12_4_ = uVar2;
                    auVar80 = minps(*(undefined1 (*) [16])
                                     ((long)pvVar59 + lVar43 * 4 + sVar9 * sVar10 * (long)pMVar35),
                                    auVar27);
                    *(undefined1 (*) [16])
                     ((long)pvVar53 + lVar43 * 4 + sVar6 * sVar5 * (long)pMVar35) = auVar80;
                    lVar43 = lVar43 + 4;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                pMVar35 = (Mat *)((long)&pMVar35->data + 1);
              } while (pMVar35 != pMVar45);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar49 ^ 1) == 0 && uVar4 == uVar48) && uVar47 == uVar3) && uVar57 != 1) {
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pMVar35 = (Mat *)0x0;
              do {
                if (0 < (int)uVar48) {
                  sVar6 = pMVar39[1].cstep;
                  sVar5 = pMVar39[1].elemsize;
                  pvVar8 = pMVar39[1].data;
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * (long)pMVar35 * this_00->elemsize +
                             (long)this_00->data);
                  pauVar46 = (undefined1 (*) [16])
                             (pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize +
                             (long)pMVar39->data);
                  uVar38 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar80 = *(undefined1 (*) [16])
                                 ((long)pvVar8 + uVar38 * 0x10 + sVar6 * (long)pMVar35 * sVar5);
                      uVar47 = uVar57;
                      do {
                        auVar69 = minps(*pauVar46,auVar80);
                        *pauVar54 = auVar69;
                        pauVar46 = pauVar46 + 1;
                        pauVar54 = pauVar54 + 1;
                        uVar47 = uVar47 - 1;
                      } while (uVar47 != 0);
                    }
                    uVar38 = uVar38 + 1;
                  } while (uVar38 != uVar48);
                }
                pMVar35 = (Mat *)((long)&pMVar35->data + 1);
              } while (pMVar35 != pMVar45);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_90 = pMVar45;
        if (((uVar4 == 1 && (uVar49 ^ uVar57) == 0) && uVar3 == uVar47) && uVar48 != 1) {
          local_88 = pMVar39;
          Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_90) {
              pMVar39 = (Mat *)0x0;
              do {
                if (0 < (int)uVar48) {
                  sVar6 = local_88[1].elemsize;
                  pvVar53 = (void *)(this_00->cstep * (long)pMVar39 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar59 = (void *)(local_88->cstep * (long)pMVar39 * local_88->elemsize +
                                    (long)local_88->data);
                  sVar5 = local_88[1].cstep;
                  pvVar8 = local_88[1].data;
                  uVar47 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      lVar43 = 0;
                      do {
                        auVar80 = minps(*(undefined1 (*) [16])
                                         ((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar39),
                                        *(undefined1 (*) [16])((long)pvVar59 + lVar43));
                        *(undefined1 (*) [16])((long)pvVar53 + lVar43) = auVar80;
                        lVar43 = lVar43 + 0x10;
                      } while ((ulong)uVar57 << 4 != lVar43);
                      pvVar53 = (void *)((long)pvVar53 + lVar43);
                      pvVar59 = (void *)((long)pvVar59 + lVar43);
                    }
                    uVar47 = uVar47 + 1;
                  } while (uVar47 != uVar48);
                }
                pMVar39 = (Mat *)((long)&pMVar39->data + 1);
              } while (pMVar39 != local_90);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar57 ^ 1) == 0 && uVar48 == uVar4) && uVar3 == uVar47) && uVar49 != 1) {
          local_88 = pMVar39;
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_90) {
              pMVar39 = (Mat *)0x0;
              do {
                if (0 < (int)uVar4) {
                  sVar6 = local_88->cstep;
                  sVar5 = local_88->elemsize;
                  pvVar8 = local_88->data;
                  pauVar54 = (undefined1 (*) [16])
                             (this_00->cstep * (long)pMVar39 * this_00->elemsize +
                             (long)this_00->data);
                  pauVar46 = (undefined1 (*) [16])
                             (local_88[1].cstep * (long)pMVar39 * local_88[1].elemsize +
                             (long)local_88[1].data);
                  uVar38 = 0;
                  do {
                    if (0 < (int)uVar49) {
                      auVar80 = *(undefined1 (*) [16])
                                 ((long)pvVar8 + uVar38 * 0x10 + sVar6 * (long)pMVar39 * sVar5);
                      uVar57 = uVar49;
                      do {
                        auVar69 = minps(*pauVar46,auVar80);
                        *pauVar54 = auVar69;
                        pauVar46 = pauVar46 + 1;
                        pauVar54 = pauVar54 + 1;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    uVar38 = uVar38 + 1;
                  } while (uVar38 != uVar4);
                }
                pMVar39 = (Mat *)((long)&pMVar39->data + 1);
              } while (pMVar39 != local_90);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_88 = pMVar39;
        if ((((uVar49 ^ uVar57) == 0 && uVar48 == 1) && uVar47 == uVar3) && uVar4 != 1) {
          Mat::create(this_00,uVar49,uVar4,uVar3,sVar5,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_90) {
              pMVar39 = (Mat *)0x0;
              do {
                if (0 < (int)uVar4) {
                  sVar6 = local_88->elemsize;
                  pvVar53 = (void *)(this_00->cstep * (long)pMVar39 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar59 = (void *)(local_88[1].cstep * (long)pMVar39 * local_88[1].elemsize +
                                    (long)local_88[1].data);
                  sVar5 = local_88->cstep;
                  pvVar8 = local_88->data;
                  uVar57 = 0;
                  do {
                    if (0 < (int)uVar49) {
                      lVar43 = 0;
                      do {
                        auVar80 = minps(*(undefined1 (*) [16])((long)pvVar59 + lVar43),
                                        *(undefined1 (*) [16])
                                         ((long)pvVar8 + lVar43 + sVar6 * sVar5 * (long)pMVar39));
                        *(undefined1 (*) [16])((long)pvVar53 + lVar43) = auVar80;
                        lVar43 = lVar43 + 0x10;
                      } while ((ulong)uVar49 << 4 != lVar43);
                      pvVar53 = (void *)((long)pvVar53 + lVar43);
                      pvVar59 = (void *)((long)pvVar59 + lVar43);
                    }
                    uVar57 = uVar57 + 1;
                  } while (uVar57 != uVar4);
                }
                pMVar39 = (Mat *)((long)&pMVar39->data + 1);
              } while (pMVar39 != local_90);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003ccf59;
      }
      if (pMVar39[1].dims == 4) {
        Mat::create(this_00,uVar49,uVar4,iVar42,uVar3,sVar5,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pMVar35 = (Mat *)0x0;
            do {
              if (0 < iVar42) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * (long)pMVar35 * this_00->elemsize + (long)this_00->data
                           );
                pauVar46 = (undefined1 (*) [16])
                           (pMVar39[1].cstep * (long)pMVar35 * pMVar39[1].elemsize +
                           (long)pMVar39[1].data);
                pauVar50 = (undefined1 (*) [16])
                           (pMVar39->cstep * (long)pMVar35 * pMVar39->elemsize + (long)pMVar39->data
                           );
                iVar34 = 0;
                do {
                  if (0 < (int)uVar4) {
                    uVar57 = 0;
                    do {
                      if (0 < (int)uVar49) {
                        auVar80 = *pauVar50;
                        uVar48 = uVar49;
                        do {
                          auVar69 = minps(*pauVar46,auVar80);
                          *pauVar54 = auVar69;
                          pauVar46 = pauVar46 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar48 = uVar48 - 1;
                        } while (uVar48 != 0);
                      }
                      pauVar50 = pauVar50 + 1;
                      uVar57 = uVar57 + 1;
                    } while (uVar57 != uVar4);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar42);
              }
              pMVar35 = (Mat *)((long)&pMVar35->data + 1);
            } while (pMVar35 != pMVar45);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar57,uVar48,uVar47,sVar6,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar39[1].dims != 1) {
        if (pMVar39[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < (int)uVar48) {
              pauVar54 = (undefined1 (*) [16])
                         (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
              pauVar50 = (undefined1 (*) [16])
                         ((long)pMVar39[1].w * uVar36 * pMVar39[1].elemsize + (long)pMVar39[1].data)
              ;
              pauVar46 = (undefined1 (*) [16])
                         (pMVar39->cstep * uVar36 * pMVar39->elemsize + (long)pMVar39->data);
              uVar47 = 0;
              do {
                if (0 < (int)uVar57) {
                  auVar80 = *pauVar50;
                  uVar49 = uVar57;
                  do {
                    auVar69 = minps(*pauVar46,auVar80);
                    *pauVar54 = auVar69;
                    pauVar46 = pauVar46 + 1;
                    pauVar54 = pauVar54 + 1;
                    uVar49 = uVar49 - 1;
                  } while (uVar49 != 0);
                }
                pauVar50 = pauVar50 + 1;
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar48);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
      if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < (int)local_a0) {
              sVar6 = this_00->cstep;
              sVar5 = this_00->elemsize;
              auVar80 = *(undefined1 (*) [16])((long)pMVar35->data + uVar36 * 0x10);
              pvVar8 = this_00->data;
              sVar9 = pMVar39->cstep;
              sVar10 = pMVar39->elemsize;
              pvVar53 = pMVar39->data;
              lVar43 = 0;
              iVar34 = (int)local_a0;
              do {
                auVar69 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36),auVar80);
                *(undefined1 (*) [16])((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36) = auVar69;
                lVar43 = lVar43 + 0x10;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
      break;
    case 4:
      if (pMVar39[1].dims == 4) goto LAB_003ccf59;
      local_90 = pMVar35;
      Mat::create(this_00,uVar57,uVar48,iVar41,uVar47,sVar6,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = pMVar39[1].dims;
      if (iVar34 != 1) {
        if (iVar34 == 3) {
          if (0 < (int)uVar47) {
            uVar36 = 0;
            do {
              if (0 < iVar41) {
                pauVar54 = (undefined1 (*) [16])
                           (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
                pauVar50 = (undefined1 (*) [16])
                           (pMVar39[1].cstep * uVar36 * pMVar39[1].elemsize + (long)pMVar39[1].data)
                ;
                pauVar46 = (undefined1 (*) [16])
                           (pMVar39->cstep * uVar36 * pMVar39->elemsize + (long)pMVar39->data);
                iVar34 = 0;
                do {
                  if (0 < (int)uVar48) {
                    uVar47 = 0;
                    do {
                      if (0 < (int)uVar57) {
                        auVar80 = *pauVar50;
                        uVar49 = uVar57;
                        do {
                          auVar69 = minps(*pauVar46,auVar80);
                          *pauVar54 = auVar69;
                          pauVar46 = pauVar46 + 1;
                          pauVar54 = pauVar54 + 1;
                          uVar49 = uVar49 - 1;
                        } while (uVar49 != 0);
                      }
                      pauVar50 = pauVar50 + 1;
                      uVar47 = uVar47 + 1;
                    } while (uVar47 != uVar48);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar41);
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 != uVar38);
            return 0;
          }
          return 0;
        }
        if (iVar34 != 2) {
          return 0;
        }
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < iVar41) {
              pauVar54 = (undefined1 (*) [16])
                         (this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
              pauVar50 = (undefined1 (*) [16])
                         ((long)pMVar39[1].w * uVar36 * pMVar39[1].elemsize + (long)pMVar39[1].data)
              ;
              pauVar46 = (undefined1 (*) [16])
                         (pMVar39->cstep * uVar36 * pMVar39->elemsize + (long)pMVar39->data);
              iVar34 = 0;
              do {
                if (0 < (int)uVar48) {
                  auVar80 = *pauVar50;
                  uVar47 = 0;
                  do {
                    uVar49 = uVar57;
                    if (0 < (int)uVar57) {
                      do {
                        auVar69 = minps(*pauVar46,auVar80);
                        *pauVar54 = auVar69;
                        pauVar46 = pauVar46 + 1;
                        pauVar54 = pauVar54 + 1;
                        uVar49 = uVar49 - 1;
                      } while (uVar49 != 0);
                    }
                    uVar47 = uVar47 + 1;
                  } while (uVar47 != uVar48);
                }
                pauVar50 = pauVar50 + 1;
                iVar34 = iVar34 + 1;
              } while (iVar34 != iVar41);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
      pMVar35 = local_90;
      if ((int)local_c0 != 1 || pMVar39[1].w != 1) {
        if (0 < (int)uVar47) {
          uVar36 = 0;
          do {
            if (0 < (int)local_a0) {
              sVar6 = pMVar39->cstep;
              sVar5 = pMVar39->elemsize;
              auVar80 = *(undefined1 (*) [16])((long)local_90->data + uVar36 * 0x10);
              pvVar8 = pMVar39->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar53 = this_00->data;
              lVar43 = 0;
              iVar34 = (int)local_a0;
              do {
                auVar69 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar8 + lVar43 + sVar6 * sVar5 * uVar36),auVar80);
                *(undefined1 (*) [16])((long)pvVar53 + lVar43 + sVar9 * sVar10 * uVar36) = auVar69;
                lVar43 = lVar43 + 0x10;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar38);
          return 0;
        }
        return 0;
      }
    }
    iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_min>
                       (pMVar39,pMVar35,this_00,(Option *)local_b8._0_8_);
    return iVar34;
  case 6:
    if (3 < pMVar39->dims - 1U) {
      return 0;
    }
    uVar57 = pMVar39->w;
    local_a0 = (float *)(ulong)uVar57;
    uVar48 = pMVar39->h;
    local_c0 = (float *)(ulong)uVar48;
    iVar41 = pMVar39->d;
    uVar47 = pMVar39->c;
    uVar38 = (ulong)uVar47;
    local_40 = CONCAT44(local_40._4_4_,uVar48 * uVar57 * iVar41);
    local_38 = pMVar39->elemsize;
    uVar49 = pMVar39[1].w;
    local_c8 = (float *)(ulong)uVar49;
    local_b8._0_4_ = pMVar39[1].h;
    local_b8._4_4_ = 0;
    iVar42 = pMVar39[1].d;
    uVar4 = pMVar39[1].c;
    local_78 = (ulong)uVar4;
    local_98 = CONCAT44(local_98._4_4_,iVar42);
    iVar40 = local_b8._0_4_ * uVar49 * iVar42;
    sVar6 = pMVar39[1].elemsize;
    local_90._0_4_ = iVar40;
    switch(pMVar39->dims) {
    case 1:
      if (iVar34 == 1 && uVar57 == 1) {
        local_88 = pMVar39;
        local_80 = this_00;
        Mat::create_like(this_00,pMVar35,opt->blob_allocator);
        if (local_80->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_80->c * local_80->cstep != 0) {
          if ((int)local_78 < 1) {
            return 0;
          }
          iVar56 = (int)local_90 * iVar56;
          local_c8 = (float *)0x0;
          local_90 = (Mat *)CONCAT44(local_90._4_4_,iVar56);
          do {
            pfVar58 = (float *)(local_88[1].cstep * (long)local_c8 * local_88[1].elemsize +
                               (long)local_88[1].data);
            pauVar54 = (undefined1 (*) [16])
                       (local_80->cstep * (long)local_c8 * local_80->elemsize + (long)local_80->data
                       );
            fStack_54 = *local_88->data;
            local_b8 = ZEXT416((uint)fStack_54);
            local_58 = fStack_54;
            fStack_4c = fStack_54;
            fStack_50 = fStack_54;
            if (iVar56 < 4) {
              iVar34 = 0;
            }
            else {
              iVar41 = 0;
              do {
                _local_68 = *(undefined8 *)pfVar58;
                _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                     (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                auVar26._8_4_ = extraout_XMM0_Dc;
                auVar26._0_8_ = afVar109._0_8_;
                auVar26._12_4_ = extraout_XMM0_Dd;
                *pauVar54 = auVar26;
                pfVar58 = pfVar58 + 4;
                pauVar54 = pauVar54 + 1;
                iVar34 = iVar41 + 4;
                iVar42 = iVar41 + 7;
                iVar41 = iVar34;
              } while (iVar42 < iVar56);
            }
            if (iVar34 < iVar56) {
              lVar43 = 0;
              do {
                fVar60 = powf((float)local_b8._0_4_,pfVar58[lVar43]);
                *(float *)((long)*pauVar54 + lVar43 * 4) = fVar60;
                lVar43 = lVar43 + 1;
              } while (iVar56 - iVar34 != (int)lVar43);
            }
            local_c8 = (float *)((long)local_c8 + 1);
            iVar56 = (int)local_90;
          } while (local_c8 != (float *)local_78);
          return 0;
        }
        return -100;
      }
      switch(pMVar39[1].dims) {
      case 1:
        goto switchD_003cdad5_caseD_1;
      case 2:
        local_88 = pMVar39;
        Mat::create(this_00,uVar49,local_b8._0_4_,sVar6,iVar56,opt->blob_allocator);
        pauVar54 = (undefined1 (*) [16])this_00->data;
        if (pauVar54 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < local_b8._0_4_) {
            local_c0 = (float *)local_88->data;
            pfVar58 = (float *)local_88[1].data;
            local_a0 = (float *)((ulong)local_a0 & 0xffffffff00000000);
            do {
              _local_58 = *(undefined8 *)local_c0;
              _fStack_50 = *(undefined8 *)(local_c0 + 2);
              uVar38 = (ulong)local_c8 & 0xffffffff;
              if (0 < (int)local_c8) {
                do {
                  _local_68 = *(undefined8 *)pfVar58;
                  _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                  afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                       (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                  auVar31._8_4_ = extraout_XMM0_Dc_10;
                  auVar31._0_8_ = afVar109._0_8_;
                  auVar31._12_4_ = extraout_XMM0_Dd_10;
                  *pauVar54 = auVar31;
                  pfVar58 = pfVar58 + 4;
                  pauVar54 = pauVar54 + 1;
                  uVar57 = (int)uVar38 - 1;
                  uVar38 = (ulong)uVar57;
                } while (uVar57 != 0);
              }
              local_c0 = local_c0 + 4;
              iVar34 = (int)local_a0 + 1;
              local_a0 = (float *)CONCAT44(local_a0._4_4_,iVar34);
            } while (iVar34 != local_b8._0_4_);
            return 0;
          }
          return 0;
        }
        return -100;
      case 3:
        local_88 = pMVar39;
        local_80 = this_00;
        Mat::create(this_00,uVar49,local_b8._0_4_,uVar4,sVar6,iVar56,opt->blob_allocator);
        if (local_80->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_80->c * local_80->cstep != 0) {
          if (0 < (int)local_78) {
            local_c8 = (float *)0x0;
            do {
              pfVar58 = (float *)((long)local_88->data + (long)local_c8 * 0x10);
              _local_58 = *(undefined8 *)pfVar58;
              _fStack_50 = *(undefined8 *)(pfVar58 + 2);
              if (0 < (int)local_90) {
                local_b8._0_8_ =
                     (void *)(local_80->cstep * local_80->elemsize * (long)local_c8 +
                             (long)local_80->data);
                lVar43 = local_88[1].cstep * local_88[1].elemsize * (long)local_c8;
                pvVar8 = local_88[1].data;
                lVar44 = 0;
                iVar34 = (int)local_90;
                do {
                  pfVar58 = (float *)((long)pvVar8 + lVar44 + lVar43);
                  _local_68 = *(undefined8 *)pfVar58;
                  _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                  afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                       (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                  auVar30._8_4_ = extraout_XMM0_Dc_08;
                  auVar30._0_8_ = afVar109._0_8_;
                  auVar30._12_4_ = extraout_XMM0_Dd_08;
                  *(undefined1 (*) [16])(local_b8._0_8_ + lVar44) = auVar30;
                  lVar44 = lVar44 + 0x10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              local_c8 = (float *)((long)local_c8 + 1);
            } while (local_c8 != (float *)local_78);
            return 0;
          }
          return 0;
        }
        return -100;
      case 4:
        local_88 = pMVar39;
        local_80 = this_00;
        Mat::create(this_00,uVar49,local_b8._0_4_,iVar42,uVar4,sVar6,iVar56,opt->blob_allocator);
        if (local_80->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_80->c * local_80->cstep != 0) {
          if (0 < (int)local_78) {
            local_c8 = (float *)0x0;
            do {
              pfVar58 = (float *)((long)local_88->data + (long)local_c8 * 0x10);
              _local_58 = *(undefined8 *)pfVar58;
              _fStack_50 = *(undefined8 *)(pfVar58 + 2);
              if (0 < (int)local_90) {
                local_b8._0_8_ =
                     (void *)(local_80->cstep * local_80->elemsize * (long)local_c8 +
                             (long)local_80->data);
                lVar43 = local_88[1].cstep * local_88[1].elemsize * (long)local_c8;
                pvVar8 = local_88[1].data;
                lVar44 = 0;
                iVar34 = (int)local_90;
                do {
                  pfVar58 = (float *)((long)pvVar8 + lVar44 + lVar43);
                  _local_68 = *(undefined8 *)pfVar58;
                  _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                  afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                       (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                  auVar29._8_4_ = extraout_XMM0_Dc_09;
                  auVar29._0_8_ = afVar109._0_8_;
                  auVar29._12_4_ = extraout_XMM0_Dd_09;
                  *(undefined1 (*) [16])(local_b8._0_8_ + lVar44) = auVar29;
                  lVar44 = lVar44 + 0x10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              local_c8 = (float *)((long)local_c8 + 1);
            } while (local_c8 != (float *)local_78);
            return 0;
          }
          return 0;
        }
        return -100;
      default:
        return 0;
      }
    case 2:
      pAVar7 = opt->blob_allocator;
      if (pMVar39[1].dims == 3) {
        local_88 = pMVar39;
        local_80 = this_00;
        Mat::create(this_00,uVar49,local_b8._0_4_,uVar4,sVar6,iVar56,pAVar7);
        if (local_80->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_80->c * local_80->cstep != 0) {
          if (0 < (int)local_78) {
            local_98 = 0;
            uVar37 = local_b8._0_8_;
            do {
              if (0 < (int)uVar37) {
                pauVar54 = (undefined1 (*) [16])
                           (local_80->cstep * local_98 * local_80->elemsize + (long)local_80->data);
                pfVar58 = (float *)(local_88[1].cstep * local_98 * local_88[1].elemsize +
                                   (long)local_88[1].data);
                local_c0 = (float *)((long)local_88->w * local_98 * local_88->elemsize +
                                    (long)local_88->data);
                iVar34 = 0;
                do {
                  local_a0 = (float *)CONCAT44(local_a0._4_4_,iVar34);
                  _local_58 = *(undefined8 *)local_c0;
                  _fStack_50 = *(undefined8 *)(local_c0 + 2);
                  uVar38 = (ulong)local_c8 & 0xffffffff;
                  if (0 < (int)local_c8) {
                    do {
                      _local_68 = *(undefined8 *)pfVar58;
                      _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                      afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                           (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                      auVar25._8_4_ = extraout_XMM0_Dc_04;
                      auVar25._0_8_ = afVar109._0_8_;
                      auVar25._12_4_ = extraout_XMM0_Dd_04;
                      *pauVar54 = auVar25;
                      pfVar58 = pfVar58 + 4;
                      pauVar54 = pauVar54 + 1;
                      uVar57 = (int)uVar38 - 1;
                      uVar38 = (ulong)uVar57;
                    } while (uVar57 != 0);
                  }
                  local_c0 = local_c0 + 4;
                  iVar34 = (int)local_a0 + 1;
                  uVar37 = local_b8._0_8_;
                } while (iVar34 != local_b8._0_4_);
              }
              local_98 = local_98 + 1;
            } while (local_98 != local_78);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pMVar39[1].dims == 4) {
        local_88 = pMVar39;
        local_80 = this_00;
        Mat::create(this_00,uVar49,local_b8._0_4_,iVar42,uVar4,sVar6,iVar56,pAVar7);
        if (local_80->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_80->c * local_80->cstep != 0) {
          if (0 < (int)local_78) {
            local_40 = 0;
            uVar37 = local_b8._0_8_;
            do {
              if (0 < (int)local_98) {
                pauVar54 = (undefined1 (*) [16])
                           (local_80->cstep * local_40 * local_80->elemsize + (long)local_80->data);
                pfVar58 = (float *)(local_88[1].cstep * local_40 * local_88[1].elemsize +
                                   (long)local_88[1].data);
                local_a0 = (float *)((long)local_88->w * local_40 * local_88->elemsize +
                                    (long)local_88->data);
                local_90._0_4_ = 0;
                do {
                  _local_58 = *(undefined8 *)local_a0;
                  _fStack_50 = *(undefined8 *)(local_a0 + 2);
                  if (0 < (int)uVar37) {
                    iVar34 = 0;
                    do {
                      local_c0 = (float *)CONCAT44(local_c0._4_4_,iVar34);
                      uVar38 = (ulong)local_c8 & 0xffffffff;
                      if (0 < (int)local_c8) {
                        do {
                          _local_68 = *(undefined8 *)pfVar58;
                          _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                          afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                               (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                          auVar23._8_4_ = extraout_XMM0_Dc_01;
                          auVar23._0_8_ = afVar109._0_8_;
                          auVar23._12_4_ = extraout_XMM0_Dd_01;
                          *pauVar54 = auVar23;
                          pfVar58 = pfVar58 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar57 = (int)uVar38 - 1;
                          uVar38 = (ulong)uVar57;
                        } while (uVar57 != 0);
                      }
                      iVar34 = (int)local_c0 + 1;
                      uVar37 = local_b8._0_8_;
                    } while (iVar34 != local_b8._0_4_);
                  }
                  local_a0 = local_a0 + 4;
                  local_90._0_4_ = (int)local_90 + 1;
                } while ((int)local_90 != (int)local_98);
              }
              local_40 = local_40 + 1;
            } while (local_40 != local_78);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_88 = pMVar39;
      Mat::create(this_00,uVar57,uVar48,local_38,iVar34,pAVar7);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (local_88[1].dims != 1) {
        pMVar39 = local_88;
        if (local_88[1].dims != 2) {
          return 0;
        }
LAB_003ccf8c:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_pow>
                           (pMVar39,pMVar35,this_00,opt);
        return iVar34;
      }
      Mat::create(this_00,uVar57,(int)local_c0,local_38,iVar34,opt->blob_allocator);
      pauVar54 = (undefined1 (*) [16])this_00->data;
      if (pauVar54 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (iVar56 != 1 || local_88[1].w != 1) {
        if (0 < (int)local_c0) {
          pfVar58 = (float *)local_88->data;
          local_b8._0_8_ = local_88[1].data;
          local_c8 = (float *)((ulong)local_c8 & 0xffffffff00000000);
          do {
            _local_58 = *(undefined8 *)local_b8._0_8_;
            _fStack_50 = *(undefined8 *)(local_b8._0_8_ + 8);
            uVar38 = (ulong)local_a0 & 0xffffffff;
            if (0 < (int)local_a0) {
              do {
                _local_68 = *(undefined8 *)pfVar58;
                _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                     (&local_c9,(__m128 *)&local_68,(__m128 *)&local_58);
                auVar24._8_4_ = extraout_XMM0_Dc_18;
                auVar24._0_8_ = afVar109._0_8_;
                auVar24._12_4_ = extraout_XMM0_Dd_18;
                *pauVar54 = auVar24;
                pfVar58 = pfVar58 + 4;
                pauVar54 = pauVar54 + 1;
                uVar57 = (int)uVar38 - 1;
                uVar38 = (ulong)uVar57;
              } while (uVar57 != 0);
            }
            local_b8._0_8_ = local_b8._0_8_ + 0x10;
            iVar34 = (int)local_c8 + 1;
            local_c8 = (float *)CONCAT44(local_c8._4_4_,iVar34);
          } while (iVar34 != (int)local_c0);
          return 0;
        }
        return 0;
      }
      break;
    case 3:
      if (pMVar39[1].dims == 3) {
        if (uVar4 == uVar47 && (local_b8._0_4_ == 1 && (uVar49 ^ 1) == 0)) {
          local_88 = pMVar39;
          local_80 = this_00;
          local_70 = uVar38;
          Mat::create(this_00,uVar57,uVar48,uVar47,local_38,iVar34,opt->blob_allocator);
          if (local_80->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_80->c * local_80->cstep != 0) {
            if (0 < (int)local_70) {
              local_c8 = (float *)0x0;
              do {
                local_b8._0_8_ = local_88->data;
                pvVar8 = local_80->data;
                pfVar58 = (float *)((long)local_88[1].data +
                                   local_88[1].cstep * (long)local_c8 * local_88[1].elemsize);
                _local_58 = *(undefined8 *)pfVar58;
                _fStack_50 = *(undefined8 *)(pfVar58 + 2);
                if (0 < (int)local_40) {
                  lVar43 = local_80->cstep * local_80->elemsize * (long)local_c8;
                  local_b8._0_8_ =
                       (void *)((long)local_88->data +
                               local_88->cstep * local_88->elemsize * (long)local_c8);
                  lVar44 = 0;
                  iVar34 = (int)local_40;
                  do {
                    _local_68 = *(undefined8 *)(local_b8._0_8_ + lVar44);
                    _fStack_60 = *(undefined8 *)((float *)(local_b8._0_8_ + lVar44) + 2);
                    afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                         (&local_c9,(__m128 *)&local_68,(__m128 *)&local_58);
                    auVar15._8_4_ = extraout_XMM0_Dc_03;
                    auVar15._0_8_ = afVar109._0_8_;
                    auVar15._12_4_ = extraout_XMM0_Dd_03;
                    *(undefined1 (*) [16])((long)pvVar8 + lVar44 + lVar43) = auVar15;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                local_c8 = (float *)((long)local_c8 + 1);
              } while (local_c8 != (float *)local_70);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar49 == uVar57) && (iVar56 == 1 && (uVar4 == 1 && local_b8._0_4_ == uVar48))) {
          local_88 = pMVar39;
          local_80 = this_00;
          local_70 = uVar38;
          Mat::create(this_00,uVar57,uVar48,uVar47,local_38,iVar34,opt->blob_allocator);
          if (local_80->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_80->c * local_80->cstep != 0) {
            if (0 < (int)local_70) {
              local_c0 = (float *)0x0;
              do {
                if (0 < (int)local_40) {
                  local_b8._0_8_ =
                       (void *)(local_80->cstep * local_80->elemsize * (long)local_c0 +
                               (long)local_80->data);
                  local_c8 = (float *)local_88[1].data;
                  lVar44 = local_88->cstep * local_88->elemsize * (long)local_c0;
                  pvVar8 = local_88->data;
                  lVar43 = 0;
                  iVar34 = (int)local_40;
                  do {
                    pfVar58 = (float *)((long)pvVar8 + lVar43 * 4 + lVar44);
                    _local_58 = *(undefined8 *)pfVar58;
                    _fStack_50 = *(undefined8 *)(pfVar58 + 2);
                    fStack_64 = *(float *)((long)local_c8 + lVar43);
                    local_68 = fStack_64;
                    fStack_5c = fStack_64;
                    fStack_60 = fStack_64;
                    afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                         (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                    auVar16._8_4_ = extraout_XMM0_Dc_06;
                    auVar16._0_8_ = afVar109._0_8_;
                    auVar16._12_4_ = extraout_XMM0_Dd_06;
                    *(undefined1 (*) [16])(local_b8._0_8_ + lVar43 * 4) = auVar16;
                    lVar43 = lVar43 + 4;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                local_c0 = (float *)((long)local_c0 + 1);
              } while (local_c0 != (float *)local_70);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar48 == 1 && (uVar57 ^ 1) == 0) && uVar47 == uVar4) {
          local_88 = pMVar39;
          local_80 = this_00;
          local_70 = uVar38;
          Mat::create(this_00,uVar49,local_b8._0_4_,uVar4,sVar6,iVar56,opt->blob_allocator);
          if (local_80->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_80->c * local_80->cstep != 0) {
            if (0 < (int)local_78) {
              local_c8 = (float *)0x0;
              do {
                local_b8._0_8_ = local_80->data;
                pvVar8 = local_88[1].data;
                pfVar58 = (float *)((long)local_88->data +
                                   local_88->cstep * (long)local_c8 * local_88->elemsize);
                _local_58 = *(undefined8 *)pfVar58;
                _fStack_50 = *(undefined8 *)(pfVar58 + 2);
                if (0 < (int)local_90) {
                  lVar43 = local_88[1].cstep * local_88[1].elemsize * (long)local_c8;
                  local_b8._0_8_ =
                       (void *)((long)local_80->data +
                               local_80->cstep * local_80->elemsize * (long)local_c8);
                  lVar44 = 0;
                  iVar34 = (int)local_90;
                  do {
                    pfVar58 = (float *)((long)pvVar8 + lVar44 + lVar43);
                    _local_68 = *(undefined8 *)pfVar58;
                    _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                    afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                         (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                    auVar17._8_4_ = extraout_XMM0_Dc_07;
                    auVar17._0_8_ = afVar109._0_8_;
                    auVar17._12_4_ = extraout_XMM0_Dd_07;
                    *(undefined1 (*) [16])(local_b8._0_8_ + lVar44) = auVar17;
                    lVar44 = lVar44 + 0x10;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                local_c8 = (float *)((long)local_c8 + 1);
              } while (local_c8 != (float *)local_78);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar49 == uVar57) && (iVar34 == 1)) && (local_b8._0_4_ == uVar48)) && (uVar47 == 1))
        {
          local_88 = pMVar39;
          local_80 = this_00;
          local_70 = uVar38;
          Mat::create(this_00,uVar49,local_b8._0_4_,uVar4,sVar6,iVar56,opt->blob_allocator);
          if (local_80->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_80->c * local_80->cstep != 0) {
            if (0 < (int)local_78) {
              local_c0 = (float *)0x0;
              do {
                if (0 < (int)local_90) {
                  local_c8 = (float *)local_88->data;
                  local_b8._0_8_ =
                       (void *)(local_80->cstep * local_80->elemsize * (long)local_c0 +
                               (long)local_80->data);
                  lVar44 = local_88[1].cstep * local_88[1].elemsize * (long)local_c0;
                  pvVar8 = local_88[1].data;
                  lVar43 = 0;
                  iVar34 = (int)local_90;
                  do {
                    fStack_54 = *(float *)((long)local_c8 + lVar43);
                    local_58 = fStack_54;
                    fStack_4c = fStack_54;
                    fStack_50 = fStack_54;
                    pfVar58 = (float *)((long)pvVar8 + lVar43 * 4 + lVar44);
                    _local_68 = *(undefined8 *)pfVar58;
                    _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                    afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                         (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                    auVar18._8_4_ = extraout_XMM0_Dc_11;
                    auVar18._0_8_ = afVar109._0_8_;
                    auVar18._12_4_ = extraout_XMM0_Dd_11;
                    *(undefined1 (*) [16])(local_b8._0_8_ + lVar43 * 4) = auVar18;
                    lVar43 = lVar43 + 4;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                local_c0 = (float *)((long)local_c0 + 1);
              } while (local_c0 != (float *)local_78);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar49 ^ 1) == 0 && local_b8._0_4_ == uVar48) && uVar47 == uVar4) && uVar57 != 1) {
          local_88 = pMVar39;
          local_80 = this_00;
          local_70 = uVar38;
          Mat::create(this_00,uVar57,uVar48,uVar47,local_38,iVar34,opt->blob_allocator);
          if (local_80->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_80->c * local_80->cstep != 0) {
            if (0 < (int)local_78) {
              local_98 = 0;
              do {
                if (0 < (int)local_c0) {
                  local_c8 = (float *)(local_88[1].cstep * local_98 * local_88[1].elemsize +
                                      (long)local_88[1].data);
                  pauVar54 = (undefined1 (*) [16])
                             (local_80->cstep * local_98 * local_80->elemsize + (long)local_80->data
                             );
                  pfVar58 = (float *)(local_88->cstep * local_98 * local_88->elemsize +
                                     (long)local_88->data);
                  uVar38 = 0;
                  do {
                    local_b8._0_8_ = uVar38;
                    pfVar51 = (float *)((long)local_c8 + uVar38 * 0x10);
                    _local_58 = *(undefined8 *)pfVar51;
                    _fStack_50 = *(undefined8 *)(pfVar51 + 2);
                    uVar38 = (ulong)local_a0 & 0xffffffff;
                    if (0 < (int)local_a0) {
                      do {
                        _local_68 = *(undefined8 *)pfVar58;
                        _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                        afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                             (&local_c9,(__m128 *)&local_68,(__m128 *)&local_58);
                        auVar19._8_4_ = extraout_XMM0_Dc_14;
                        auVar19._0_8_ = afVar109._0_8_;
                        auVar19._12_4_ = extraout_XMM0_Dd_14;
                        *pauVar54 = auVar19;
                        pfVar58 = pfVar58 + 4;
                        pauVar54 = pauVar54 + 1;
                        uVar57 = (int)uVar38 - 1;
                        uVar38 = (ulong)uVar57;
                      } while (uVar57 != 0);
                    }
                    uVar38 = local_b8._0_8_ + 1;
                  } while ((float *)uVar38 != local_c0);
                }
                local_98 = local_98 + 1;
              } while (local_98 != local_78);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((local_b8._0_4_ == 1 && (uVar49 ^ uVar57) == 0) && uVar4 == uVar47) && uVar48 != 1) {
          local_88 = pMVar39;
          local_80 = this_00;
          local_70 = uVar38;
          Mat::create(this_00,uVar57,uVar48,uVar47,local_38,iVar34,opt->blob_allocator);
          if (local_80->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_80->c * local_80->cstep != 0) {
            if (0 < (int)local_78) {
              lVar43 = (long)local_a0 << 4;
              local_98 = 0;
              local_c8 = (float *)lVar43;
              do {
                if (0 < (int)local_c0) {
                  pvVar53 = (void *)(local_80->cstep * local_98 * local_80->elemsize +
                                    (long)local_80->data);
                  pvVar59 = (void *)(local_88->cstep * local_98 * local_88->elemsize +
                                    (long)local_88->data);
                  lVar44 = local_88[1].elemsize * local_88[1].cstep * local_98;
                  pvVar8 = local_88[1].data;
                  iVar34 = 0;
                  pfVar58 = local_a0;
                  do {
                    if (0 < (int)pfVar58) {
                      local_b8._0_4_ = iVar34;
                      lVar55 = 0;
                      do {
                        _local_58 = *(undefined8 *)((long)pvVar59 + lVar55);
                        _fStack_50 = *(undefined8 *)((float *)((long)pvVar59 + lVar55) + 2);
                        pfVar58 = (float *)((long)pvVar8 + lVar55 + lVar44);
                        _local_68 = *(undefined8 *)pfVar58;
                        _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                        afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                             (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                        auVar20._8_4_ = extraout_XMM0_Dc_15;
                        auVar20._0_8_ = afVar109._0_8_;
                        auVar20._12_4_ = extraout_XMM0_Dd_15;
                        *(undefined1 (*) [16])((long)pvVar53 + lVar55) = auVar20;
                        lVar55 = lVar55 + 0x10;
                      } while (lVar43 != lVar55);
                      pvVar53 = (void *)((long)pvVar53 + lVar55);
                      pvVar59 = (void *)((long)pvVar59 + lVar55);
                      pfVar58 = local_a0;
                      iVar34 = local_b8._0_4_;
                    }
                    iVar34 = iVar34 + 1;
                  } while (iVar34 != (int)local_c0);
                }
                local_98 = local_98 + 1;
              } while (local_98 != local_78);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar57 ^ 1) == 0 && uVar48 == local_b8._0_4_) && uVar4 == uVar47) && uVar49 != 1) {
          local_88 = pMVar39;
          local_80 = this_00;
          local_70 = uVar38;
          Mat::create(this_00,uVar49,local_b8._0_4_,uVar4,sVar6,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_80->c * local_80->cstep != 0) {
            if (0 < (int)local_78) {
              local_98 = 0;
              lVar43 = local_b8._0_8_;
              do {
                if (0 < (int)lVar43) {
                  local_a0 = (float *)(local_88->cstep * local_98 * local_88->elemsize +
                                      (long)local_88->data);
                  pauVar54 = (undefined1 (*) [16])
                             (local_80->cstep * local_98 * local_80->elemsize + (long)local_80->data
                             );
                  pfVar58 = (float *)(local_88[1].cstep * local_98 * local_88[1].elemsize +
                                     (long)local_88[1].data);
                  local_c0 = (float *)0x0;
                  do {
                    pfVar51 = (float *)((long)local_a0 + (long)local_c0 * 0x10);
                    _local_58 = *(undefined8 *)pfVar51;
                    _fStack_50 = *(undefined8 *)(pfVar51 + 2);
                    uVar38 = (ulong)local_c8 & 0xffffffff;
                    if (0 < (int)local_c8) {
                      do {
                        _local_68 = *(undefined8 *)pfVar58;
                        _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                        afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                             (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                        auVar21._8_4_ = extraout_XMM0_Dc_17;
                        auVar21._0_8_ = afVar109._0_8_;
                        auVar21._12_4_ = extraout_XMM0_Dd_17;
                        *pauVar54 = auVar21;
                        pfVar58 = pfVar58 + 4;
                        pauVar54 = pauVar54 + 1;
                        uVar57 = (int)uVar38 - 1;
                        uVar38 = (ulong)uVar57;
                      } while (uVar57 != 0);
                    }
                    local_c0 = (float *)((long)local_c0 + 1);
                    lVar43 = local_b8._0_8_;
                  } while (local_c0 != (float *)local_b8._0_8_);
                }
                local_98 = local_98 + 1;
              } while (local_98 != local_78);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_88 = pMVar39;
        local_80 = this_00;
        local_70 = uVar38;
        if ((((uVar49 ^ uVar57) == 0 && uVar48 == 1) && uVar47 == uVar4) && local_b8._0_4_ != 1) {
          Mat::create(this_00,uVar49,local_b8._0_4_,uVar4,sVar6,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_80->c * local_80->cstep != 0) {
            if (0 < (int)local_78) {
              lVar43 = (long)local_c8 << 4;
              local_98 = 0;
              uVar37 = local_b8._0_8_;
              local_a0 = (float *)lVar43;
              do {
                if (0 < (int)uVar37) {
                  pvVar59 = (void *)(local_80->cstep * local_98 * local_80->elemsize +
                                    (long)local_80->data);
                  pvVar53 = (void *)(local_88[1].cstep * local_98 * local_88[1].elemsize +
                                    (long)local_88[1].data);
                  lVar44 = local_88->elemsize * local_88->cstep * local_98;
                  pvVar8 = local_88->data;
                  iVar34 = 0;
                  pfVar58 = local_c8;
                  do {
                    if (0 < (int)pfVar58) {
                      local_c0 = (float *)CONCAT44(local_c0._4_4_,iVar34);
                      lVar55 = 0;
                      do {
                        pfVar58 = (float *)((long)pvVar8 + lVar55 + lVar44);
                        _local_58 = *(undefined8 *)pfVar58;
                        _fStack_50 = *(undefined8 *)(pfVar58 + 2);
                        _local_68 = *(undefined8 *)((long)pvVar53 + lVar55);
                        _fStack_60 = *(undefined8 *)((float *)((long)pvVar53 + lVar55) + 2);
                        afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                             (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                        auVar22._8_4_ = extraout_XMM0_Dc_19;
                        auVar22._0_8_ = afVar109._0_8_;
                        auVar22._12_4_ = extraout_XMM0_Dd_19;
                        *(undefined1 (*) [16])((long)pvVar59 + lVar55) = auVar22;
                        lVar55 = lVar55 + 0x10;
                      } while (lVar43 != lVar55);
                      pvVar59 = (void *)((long)pvVar59 + lVar55);
                      pvVar53 = (void *)((long)pvVar53 + lVar55);
                      uVar37 = local_b8._0_8_;
                      pfVar58 = local_c8;
                      iVar34 = (int)local_c0;
                    }
                    iVar34 = iVar34 + 1;
                  } while (iVar34 != (int)uVar37);
                }
                local_98 = local_98 + 1;
              } while (local_98 != local_78);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003ccf8c;
      }
      if (pMVar39[1].dims == 4) {
        local_88 = pMVar39;
        local_80 = this_00;
        Mat::create(this_00,uVar49,local_b8._0_4_,iVar42,uVar4,sVar6,iVar56,opt->blob_allocator);
        if (local_80->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_80->c * local_80->cstep != 0) {
          if (0 < (int)local_78) {
            local_40 = 0;
            uVar37 = local_b8._0_8_;
            do {
              if (0 < (int)local_98) {
                pauVar54 = (undefined1 (*) [16])
                           (local_80->cstep * local_40 * local_80->elemsize + (long)local_80->data);
                pfVar58 = (float *)(local_88[1].cstep * local_40 * local_88[1].elemsize +
                                   (long)local_88[1].data);
                local_c0 = (float *)(local_88->cstep * local_40 * local_88->elemsize +
                                    (long)local_88->data);
                local_90._0_4_ = 0;
                do {
                  if (0 < (int)uVar37) {
                    iVar34 = 0;
                    do {
                      local_a0 = (float *)CONCAT44(local_a0._4_4_,iVar34);
                      _local_58 = *(undefined8 *)local_c0;
                      _fStack_50 = *(undefined8 *)(local_c0 + 2);
                      uVar38 = (ulong)local_c8 & 0xffffffff;
                      if (0 < (int)local_c8) {
                        do {
                          _local_68 = *(undefined8 *)pfVar58;
                          _fStack_60 = *(undefined8 *)(pfVar58 + 2);
                          afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                               (&local_c9,(__m128 *)&local_58,(__m128 *)&local_68);
                          auVar12._8_4_ = extraout_XMM0_Dc_00;
                          auVar12._0_8_ = afVar109._0_8_;
                          auVar12._12_4_ = extraout_XMM0_Dd_00;
                          *pauVar54 = auVar12;
                          pfVar58 = pfVar58 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar57 = (int)uVar38 - 1;
                          uVar38 = (ulong)uVar57;
                        } while (uVar57 != 0);
                      }
                      local_c0 = local_c0 + 4;
                      iVar34 = (int)local_a0 + 1;
                      uVar37 = local_b8._0_8_;
                    } while (iVar34 != local_b8._0_4_);
                  }
                  local_90._0_4_ = (int)local_90 + 1;
                } while ((int)local_90 != (int)local_98);
              }
              local_40 = local_40 + 1;
            } while (local_40 != local_78);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_88 = pMVar39;
      local_80 = this_00;
      local_70 = uVar38;
      Mat::create(this_00,uVar57,uVar48,uVar47,local_38,iVar34,opt->blob_allocator);
      if (local_80->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_80->c * local_80->cstep == 0) {
        return -100;
      }
      if (local_88[1].dims != 1) {
        if (local_88[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_70) {
          local_98 = 0;
          do {
            if (0 < (int)local_c0) {
              pauVar54 = (undefined1 (*) [16])
                         (local_80->cstep * local_98 * local_80->elemsize + (long)local_80->data);
              pfVar58 = (float *)((long)local_88[1].w * local_98 * local_88[1].elemsize +
                                 (long)local_88[1].data);
              pfVar51 = (float *)(local_88->cstep * local_98 * local_88->elemsize +
                                 (long)local_88->data);
              iVar34 = 0;
              do {
                local_c8 = (float *)CONCAT44(local_c8._4_4_,iVar34);
                local_b8._0_8_ = pfVar58;
                _local_58 = *(undefined8 *)pfVar58;
                _fStack_50 = *(undefined8 *)(pfVar58 + 2);
                uVar38 = (ulong)local_a0 & 0xffffffff;
                if (0 < (int)local_a0) {
                  do {
                    _local_68 = *(undefined8 *)pfVar51;
                    _fStack_60 = *(undefined8 *)(pfVar51 + 2);
                    afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                         (&local_c9,(__m128 *)&local_68,(__m128 *)&local_58);
                    auVar13._8_4_ = extraout_XMM0_Dc_05;
                    auVar13._0_8_ = afVar109._0_8_;
                    auVar13._12_4_ = extraout_XMM0_Dd_05;
                    *pauVar54 = auVar13;
                    pfVar51 = pfVar51 + 4;
                    pauVar54 = pauVar54 + 1;
                    uVar57 = (int)uVar38 - 1;
                    uVar38 = (ulong)uVar57;
                  } while (uVar57 != 0);
                }
                pfVar58 = (float *)(local_b8._0_8_ + 0x10);
                iVar34 = (int)local_c8 + 1;
              } while (iVar34 != (int)local_c0);
            }
            local_98 = local_98 + 1;
          } while (local_98 != local_70);
          return 0;
        }
        return 0;
      }
      this_00 = local_80;
      if (iVar56 != 1 || local_88[1].w != 1) {
        if (0 < (int)local_70) {
          local_c8 = (float *)0x0;
          do {
            local_b8._0_8_ = local_88->data;
            pfVar58 = (float *)((long)local_88[1].data + (long)local_c8 * 0x10);
            _local_58 = *(undefined8 *)pfVar58;
            _fStack_50 = *(undefined8 *)(pfVar58 + 2);
            if (0 < (int)local_40) {
              lVar43 = local_80->cstep * local_80->elemsize * (long)local_c8;
              pvVar8 = local_80->data;
              local_b8._0_8_ =
                   (void *)((long)local_88->data +
                           local_88->cstep * local_88->elemsize * (long)local_c8);
              lVar44 = 0;
              iVar34 = (int)local_40;
              do {
                _local_68 = *(undefined8 *)(local_b8._0_8_ + lVar44);
                _fStack_60 = *(undefined8 *)((float *)(local_b8._0_8_ + lVar44) + 2);
                afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                     (&local_c9,(__m128 *)&local_68,(__m128 *)&local_58);
                auVar14._8_4_ = extraout_XMM0_Dc_16;
                auVar14._0_8_ = afVar109._0_8_;
                auVar14._12_4_ = extraout_XMM0_Dd_16;
                *(undefined1 (*) [16])((long)pvVar8 + lVar44 + lVar43) = auVar14;
                lVar44 = lVar44 + 0x10;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
            }
            local_c8 = (float *)((long)local_c8 + 1);
          } while (local_c8 != (float *)local_70);
          return 0;
        }
        return 0;
      }
      break;
    case 4:
      local_98 = CONCAT44(local_98._4_4_,iVar41);
      if (pMVar39[1].dims == 4) goto LAB_003ccf8c;
      local_88 = pMVar39;
      local_80 = this_00;
      local_70 = uVar38;
      Mat::create(this_00,uVar57,uVar48,iVar41,uVar47,local_38,iVar34,opt->blob_allocator);
      if (local_80->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_80->c * local_80->cstep == 0) {
        return -100;
      }
      iVar34 = local_88[1].dims;
      if (iVar34 != 1) {
        if (iVar34 == 3) {
          if (0 < (int)local_70) {
            local_78 = 0;
            do {
              if (0 < (int)local_98) {
                pauVar54 = (undefined1 (*) [16])
                           (local_80->cstep * local_78 * local_80->elemsize + (long)local_80->data);
                pfVar51 = (float *)(local_88[1].cstep * local_78 * local_88[1].elemsize +
                                   (long)local_88[1].data);
                pfVar52 = (float *)(local_88->cstep * local_78 * local_88->elemsize +
                                   (long)local_88->data);
                local_90._0_4_ = 0;
                pfVar58 = local_c0;
                do {
                  if (0 < (int)pfVar58) {
                    iVar34 = 0;
                    do {
                      local_c8 = (float *)CONCAT44(local_c8._4_4_,iVar34);
                      local_b8._0_8_ = pfVar51;
                      _local_58 = *(undefined8 *)pfVar51;
                      _fStack_50 = *(undefined8 *)(pfVar51 + 2);
                      uVar38 = (ulong)local_a0 & 0xffffffff;
                      if (0 < (int)local_a0) {
                        do {
                          _local_68 = *(undefined8 *)pfVar52;
                          _fStack_60 = *(undefined8 *)(pfVar52 + 2);
                          afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                               (&local_c9,(__m128 *)&local_68,(__m128 *)&local_58);
                          auVar69._8_4_ = extraout_XMM0_Dc_12;
                          auVar69._0_8_ = afVar109._0_8_;
                          auVar69._12_4_ = extraout_XMM0_Dd_12;
                          *pauVar54 = auVar69;
                          pfVar52 = pfVar52 + 4;
                          pauVar54 = pauVar54 + 1;
                          uVar57 = (int)uVar38 - 1;
                          uVar38 = (ulong)uVar57;
                        } while (uVar57 != 0);
                      }
                      pfVar51 = (float *)(local_b8._0_8_ + 0x10);
                      iVar34 = (int)local_c8 + 1;
                      pfVar58 = local_c0;
                    } while (iVar34 != (int)local_c0);
                  }
                  local_90._0_4_ = (int)local_90 + 1;
                } while ((int)local_90 != (int)local_98);
              }
              local_78 = local_78 + 1;
            } while (local_78 != local_70);
            return 0;
          }
          return 0;
        }
        if (iVar34 != 2) {
          return 0;
        }
        if (0 < (int)local_70) {
          local_78 = 0;
          do {
            if (0 < (int)local_98) {
              pauVar54 = (undefined1 (*) [16])
                         (local_80->cstep * local_78 * local_80->elemsize + (long)local_80->data);
              local_c8 = (float *)((long)local_88[1].w * local_78 * local_88[1].elemsize +
                                  (long)local_88[1].data);
              pfVar51 = (float *)(local_88->cstep * local_78 * local_88->elemsize +
                                 (long)local_88->data);
              local_90._0_4_ = 0;
              pfVar58 = local_c0;
              do {
                _local_58 = *(undefined8 *)local_c8;
                _fStack_50 = *(undefined8 *)(local_c8 + 2);
                if (0 < (int)pfVar58) {
                  iVar34 = 0;
                  do {
                    local_b8._0_4_ = iVar34;
                    uVar38 = (ulong)local_a0 & 0xffffffff;
                    if (0 < (int)local_a0) {
                      do {
                        _local_68 = *(undefined8 *)pfVar51;
                        _fStack_60 = *(undefined8 *)(pfVar51 + 2);
                        afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                             (&local_c9,(__m128 *)&local_68,(__m128 *)&local_58);
                        auVar11._8_4_ = extraout_XMM0_Dc_02;
                        auVar11._0_8_ = afVar109._0_8_;
                        auVar11._12_4_ = extraout_XMM0_Dd_02;
                        *pauVar54 = auVar11;
                        pfVar51 = pfVar51 + 4;
                        pauVar54 = pauVar54 + 1;
                        uVar57 = (int)uVar38 - 1;
                        uVar38 = (ulong)uVar57;
                      } while (uVar57 != 0);
                    }
                    iVar34 = local_b8._0_4_ + 1;
                    pfVar58 = local_c0;
                  } while (iVar34 != (int)local_c0);
                }
                local_c8 = local_c8 + 4;
                local_90._0_4_ = (int)local_90 + 1;
              } while ((int)local_90 != (int)local_98);
            }
            local_78 = local_78 + 1;
          } while (local_78 != local_70);
          return 0;
        }
        return 0;
      }
      this_00 = local_80;
      if (iVar56 != 1 || local_88[1].w != 1) {
        if (0 < (int)local_70) {
          local_c8 = (float *)0x0;
          do {
            local_b8._0_8_ = local_88->data;
            pfVar58 = (float *)((long)local_88[1].data + (long)local_c8 * 0x10);
            _local_58 = *(undefined8 *)pfVar58;
            _fStack_50 = *(undefined8 *)(pfVar58 + 2);
            if (0 < (int)local_40) {
              local_b8._0_8_ =
                   (void *)((long)local_88->data +
                           local_88->cstep * local_88->elemsize * (long)local_c8);
              lVar44 = local_80->cstep * local_80->elemsize * (long)local_c8;
              pvVar8 = local_80->data;
              lVar43 = 0;
              iVar34 = (int)local_40;
              do {
                _local_68 = *(undefined8 *)(local_b8._0_8_ + lVar43);
                _fStack_60 = *(undefined8 *)((float *)(local_b8._0_8_ + lVar43) + 2);
                afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                     (&local_c9,(__m128 *)&local_68,(__m128 *)&local_58);
                auVar80._8_4_ = extraout_XMM0_Dc_13;
                auVar80._0_8_ = afVar109._0_8_;
                auVar80._12_4_ = extraout_XMM0_Dd_13;
                *(undefined1 (*) [16])((long)pvVar8 + lVar43 + lVar44) = auVar80;
                lVar43 = lVar43 + 0x10;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
            }
            local_c8 = (float *)((long)local_c8 + 1);
          } while (local_c8 != (float *)local_70);
          return 0;
        }
        return 0;
      }
    }
LAB_003d159d:
    iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_pow>
                       (local_88,pMVar35,this_00,opt);
    return iVar34;
  case 7:
    pMVar45 = pMVar39;
    pMVar39 = pMVar35;
    break;
  case 8:
    pMVar45 = pMVar39;
    pMVar39 = pMVar35;
LAB_003cc5f7:
    iVar34 = binary_op_pack4<ncnn::BinaryOp_x86_functor::binary_op_div>(pMVar39,pMVar45,this_00,opt)
    ;
    return iVar34;
  }
  iVar34 = binary_op_pack4<ncnn::BinaryOp_x86_functor::binary_op_sub>(pMVar39,pMVar45,this_00,opt);
  return iVar34;
switchD_003cdad5_caseD_1:
  local_88 = pMVar39;
  Mat::create(this_00,uVar57,local_38,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (iVar56 != 1 || local_88[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_pow>(local_88,pMVar35,this_00,opt);
    return 0;
  }
  goto LAB_003d159d;
}

Assistant:

int BinaryOp_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    using namespace BinaryOp_x86_functor;

    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16 || elempack1 == 16)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack16<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack16<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack16<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack16<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack16<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack16<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack16<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX512F__

    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}